

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

void ImGui::ShowDemoWindow(bool *p_open)

{
  undefined8 uVar1;
  char cVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  bool bVar27;
  bool bVar28;
  bool bVar29;
  ImGuiID id;
  ImU32 IVar30;
  ImU32 IVar31;
  ImGuiMouseCursor IVar32;
  void *pvVar33;
  ImGuiIO *pIVar34;
  ImGuiViewport *pIVar35;
  ImDrawList *pIVar36;
  ImGuiStyle *pIVar37;
  ImGuiKeyData *pIVar38;
  uint uVar39;
  ulong uVar40;
  char *pcVar41;
  int obj_i;
  int iVar42;
  ImGuiKey key;
  bool *pbVar43;
  int i;
  ImGuiWindowFlags flags;
  long lVar44;
  char *pcVar45;
  char *pcVar46;
  int i_8;
  int i_2;
  undefined8 *puVar47;
  MyDocument *doc;
  int doc_n;
  long lVar48;
  undefined **ppuVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  long lVar53;
  double dVar54;
  ImVec2 IVar55;
  ImVec2 IVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar68;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  long lVar67;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined8 extraout_XMM0_Qb_03;
  undefined1 auVar69 [16];
  undefined1 auVar71 [16];
  uint uVar74;
  ulong uVar72;
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  int iVar91;
  undefined1 auVar89 [16];
  int iVar92;
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  int iVar106;
  int iVar110;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  ImVec2 canvas_sz;
  ImVec2 gradient_size;
  char label [128];
  float local_168;
  float fStack_164;
  undefined4 uStack_15c;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148 [2];
  undefined1 local_138 [8];
  undefined8 uStack_130;
  ImVec2 local_120;
  undefined1 local_118 [8];
  undefined8 uStack_110;
  ImVec2 local_100;
  float local_f4;
  ImVec2 local_f0;
  ImVec2 local_e8;
  int local_dc;
  undefined1 local_d8 [8];
  ImVec2 IStack_d0;
  ImVec2 local_c8;
  ImVec2 IStack_c0;
  char *local_b8;
  char *pcStack_b0;
  char *local_a8;
  bool *local_50;
  ImVec2 local_48;
  undefined8 uStack_40;
  long lVar70;
  
  if ((ShowDemoWindow::show_app_main_menu_bar) && (bVar27 = BeginMainMenuBar(), bVar27)) {
    bVar27 = BeginMenu("File",true);
    if (bVar27) {
      ShowExampleMenuFile();
      EndMenu();
    }
    bVar27 = BeginMenu("Edit",true);
    if (bVar27) {
      MenuItem("Undo","CTRL+Z",false,true);
      MenuItem("Redo","CTRL+Y",false,false);
      Separator();
      MenuItem("Cut","CTRL+X",false,true);
      MenuItem("Copy","CTRL+C",false,true);
      MenuItem("Paste","CTRL+V",false,true);
      EndMenu();
    }
    EndMainMenuBar();
  }
  if (ShowDemoWindow::show_app_documents != true) goto LAB_0013a0c7;
  if ((ShowExampleAppDocuments(bool*)::app == '\0') &&
     (iVar42 = __cxa_guard_acquire(&ShowExampleAppDocuments(bool*)::app), iVar42 != 0)) {
    ExampleAppDocuments::ExampleAppDocuments
              ((ExampleAppDocuments *)&ShowExampleAppDocuments(bool*)::app);
    __cxa_atexit(ExampleAppDocuments::~ExampleAppDocuments,&ShowExampleAppDocuments(bool*)::app,
                 &__dso_handle);
    __cxa_guard_release(&ShowExampleAppDocuments(bool*)::app);
  }
  bVar27 = Begin("Example: Documents",&ShowDemoWindow::show_app_documents,0x400);
  if (bVar27) {
    bVar27 = BeginMenuBar();
    if (bVar27) {
      bVar27 = BeginMenu("File",true);
      if (bVar27) {
        if ((long)ShowExampleAppDocuments(bool*)::app < 1) {
          iVar42 = 0;
        }
        else {
          lVar44 = 0;
          iVar42 = 0;
          do {
            iVar42 = iVar42 + (uint)*(byte *)(DAT_001b4398 + 8 + lVar44);
            lVar44 = lVar44 + 0x20;
          } while ((long)ShowExampleAppDocuments(bool*)::app << 5 != lVar44);
        }
        bVar27 = BeginMenu("Open",iVar42 < ShowExampleAppDocuments(bool*)::app);
        if (bVar27) {
          if (0 < ShowExampleAppDocuments(bool*)::app) {
            lVar44 = 8;
            lVar48 = 0;
            do {
              lVar53 = DAT_001b4398;
              if ((*(char *)(DAT_001b4398 + lVar44) == '\0') &&
                 (bVar27 = MenuItem(*(char **)(DAT_001b4398 + -8 + lVar44),(char *)0x0,false,true),
                 bVar27)) {
                *(undefined1 *)(lVar53 + lVar44) = 1;
              }
              lVar48 = lVar48 + 1;
              lVar44 = lVar44 + 0x20;
            } while (lVar48 < ShowExampleAppDocuments(bool*)::app);
          }
          EndMenu();
        }
        bVar27 = MenuItem("Close All Documents",(char *)0x0,false,iVar42 != 0);
        lVar44 = DAT_001b4398;
        auVar26 = _DAT_0017b310;
        if ((bVar27) && (0 < (long)ShowExampleAppDocuments(bool*)::app)) {
          uVar39 = ShowExampleAppDocuments(bool*)::app + 0xf;
          lVar48 = (long)ShowExampleAppDocuments(bool*)::app + -1;
          auVar57._8_4_ = (int)lVar48;
          auVar57._0_8_ = lVar48;
          auVar57._12_4_ = (int)((ulong)lVar48 >> 0x20);
          lVar48 = 0;
          auVar58 = auVar57;
          auVar69 = _DAT_00185230;
          auVar71 = _DAT_00185240;
          auVar73 = _DAT_00185250;
          auVar75 = _DAT_00185260;
          auVar76 = _DAT_00185270;
          auVar77 = _DAT_00185280;
          auVar78 = _DAT_00185290;
          auVar79 = _DAT_0017e7d0;
          do {
            auVar89 = auVar57 ^ auVar26;
            auVar93 = auVar79 ^ auVar26;
            iVar42 = auVar89._0_4_;
            iVar106 = -(uint)(iVar42 < auVar93._0_4_);
            iVar68 = auVar89._4_4_;
            auVar95._4_4_ = -(uint)(iVar68 < auVar93._4_4_);
            iVar91 = auVar89._8_4_;
            iVar110 = -(uint)(iVar91 < auVar93._8_4_);
            iVar92 = auVar89._12_4_;
            auVar95._12_4_ = -(uint)(iVar92 < auVar93._12_4_);
            auVar89._4_4_ = iVar106;
            auVar89._0_4_ = iVar106;
            auVar89._8_4_ = iVar110;
            auVar89._12_4_ = iVar110;
            auVar89 = pshuflw(auVar58,auVar89,0xe8);
            auVar94._4_4_ = -(uint)(auVar93._4_4_ == iVar68);
            auVar94._12_4_ = -(uint)(auVar93._12_4_ == iVar92);
            auVar94._0_4_ = auVar94._4_4_;
            auVar94._8_4_ = auVar94._12_4_;
            auVar80 = pshuflw(in_XMM11,auVar94,0xe8);
            auVar95._0_4_ = auVar95._4_4_;
            auVar95._8_4_ = auVar95._12_4_;
            auVar93 = pshuflw(auVar89,auVar95,0xe8);
            auVar58._8_4_ = 0xffffffff;
            auVar58._0_8_ = 0xffffffffffffffff;
            auVar58._12_4_ = 0xffffffff;
            auVar58 = (auVar93 | auVar80 & auVar89) ^ auVar58;
            auVar58 = packssdw(auVar58,auVar58);
            if ((auVar58 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)(lVar44 + 0xb + lVar48) = 1;
            }
            auVar80._4_4_ = iVar106;
            auVar80._0_4_ = iVar106;
            auVar80._8_4_ = iVar110;
            auVar80._12_4_ = iVar110;
            auVar95 = auVar94 & auVar80 | auVar95;
            auVar58 = packssdw(auVar95,auVar95);
            auVar93._8_4_ = 0xffffffff;
            auVar93._0_8_ = 0xffffffffffffffff;
            auVar93._12_4_ = 0xffffffff;
            auVar58 = packssdw(auVar58 ^ auVar93,auVar58 ^ auVar93);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._0_4_ >> 8 & 1) != 0) {
              *(undefined1 *)(lVar44 + 0x2b + lVar48) = 1;
            }
            auVar58 = auVar78 ^ auVar26;
            auVar81._0_4_ = -(uint)(iVar42 < auVar58._0_4_);
            auVar81._4_4_ = -(uint)(iVar68 < auVar58._4_4_);
            auVar81._8_4_ = -(uint)(iVar91 < auVar58._8_4_);
            auVar81._12_4_ = -(uint)(iVar92 < auVar58._12_4_);
            auVar96._4_4_ = auVar81._0_4_;
            auVar96._0_4_ = auVar81._0_4_;
            auVar96._8_4_ = auVar81._8_4_;
            auVar96._12_4_ = auVar81._8_4_;
            iVar106 = -(uint)(auVar58._4_4_ == iVar68);
            iVar110 = -(uint)(auVar58._12_4_ == iVar92);
            auVar13._4_4_ = iVar106;
            auVar13._0_4_ = iVar106;
            auVar13._8_4_ = iVar110;
            auVar13._12_4_ = iVar110;
            auVar107._4_4_ = auVar81._4_4_;
            auVar107._0_4_ = auVar81._4_4_;
            auVar107._8_4_ = auVar81._12_4_;
            auVar107._12_4_ = auVar81._12_4_;
            auVar58 = auVar13 & auVar96 | auVar107;
            auVar58 = packssdw(auVar58,auVar58);
            auVar4._8_4_ = 0xffffffff;
            auVar4._0_8_ = 0xffffffffffffffff;
            auVar4._12_4_ = 0xffffffff;
            auVar58 = packssdw(auVar58 ^ auVar4,auVar58 ^ auVar4);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._0_4_ >> 0x10 & 1) != 0) {
              *(undefined1 *)(lVar44 + 0x4b + lVar48) = 1;
            }
            auVar58 = pshufhw(auVar58,auVar96,0x84);
            auVar14._4_4_ = iVar106;
            auVar14._0_4_ = iVar106;
            auVar14._8_4_ = iVar110;
            auVar14._12_4_ = iVar110;
            auVar93 = pshufhw(auVar81,auVar14,0x84);
            auVar89 = pshufhw(auVar58,auVar107,0x84);
            auVar59._8_4_ = 0xffffffff;
            auVar59._0_8_ = 0xffffffffffffffff;
            auVar59._12_4_ = 0xffffffff;
            auVar59 = (auVar89 | auVar93 & auVar58) ^ auVar59;
            auVar58 = packssdw(auVar59,auVar59);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._0_4_ >> 0x18 & 1) != 0) {
              *(undefined1 *)(lVar44 + 0x6b + lVar48) = 1;
            }
            auVar58 = auVar77 ^ auVar26;
            auVar82._0_4_ = -(uint)(iVar42 < auVar58._0_4_);
            auVar82._4_4_ = -(uint)(iVar68 < auVar58._4_4_);
            auVar82._8_4_ = -(uint)(iVar91 < auVar58._8_4_);
            auVar82._12_4_ = -(uint)(iVar92 < auVar58._12_4_);
            auVar15._4_4_ = auVar82._0_4_;
            auVar15._0_4_ = auVar82._0_4_;
            auVar15._8_4_ = auVar82._8_4_;
            auVar15._12_4_ = auVar82._8_4_;
            auVar93 = pshuflw(auVar107,auVar15,0xe8);
            auVar60._0_4_ = -(uint)(auVar58._0_4_ == iVar42);
            auVar60._4_4_ = -(uint)(auVar58._4_4_ == iVar68);
            auVar60._8_4_ = -(uint)(auVar58._8_4_ == iVar91);
            auVar60._12_4_ = -(uint)(auVar58._12_4_ == iVar92);
            auVar97._4_4_ = auVar60._4_4_;
            auVar97._0_4_ = auVar60._4_4_;
            auVar97._8_4_ = auVar60._12_4_;
            auVar97._12_4_ = auVar60._12_4_;
            auVar58 = pshuflw(auVar60,auVar97,0xe8);
            auVar98._4_4_ = auVar82._4_4_;
            auVar98._0_4_ = auVar82._4_4_;
            auVar98._8_4_ = auVar82._12_4_;
            auVar98._12_4_ = auVar82._12_4_;
            auVar89 = pshuflw(auVar82,auVar98,0xe8);
            auVar5._8_4_ = 0xffffffff;
            auVar5._0_8_ = 0xffffffffffffffff;
            auVar5._12_4_ = 0xffffffff;
            auVar58 = packssdw(auVar58 & auVar93,(auVar89 | auVar58 & auVar93) ^ auVar5);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)(lVar44 + 0x8b + lVar48) = 1;
            }
            auVar16._4_4_ = auVar82._0_4_;
            auVar16._0_4_ = auVar82._0_4_;
            auVar16._8_4_ = auVar82._8_4_;
            auVar16._12_4_ = auVar82._8_4_;
            auVar98 = auVar97 & auVar16 | auVar98;
            auVar89 = packssdw(auVar98,auVar98);
            auVar6._8_4_ = 0xffffffff;
            auVar6._0_8_ = 0xffffffffffffffff;
            auVar6._12_4_ = 0xffffffff;
            auVar58 = packssdw(auVar58,auVar89 ^ auVar6);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._4_2_ >> 8 & 1) != 0) {
              *(undefined1 *)(lVar44 + 0xab + lVar48) = 1;
            }
            auVar58 = auVar76 ^ auVar26;
            auVar83._0_4_ = -(uint)(iVar42 < auVar58._0_4_);
            auVar83._4_4_ = -(uint)(iVar68 < auVar58._4_4_);
            auVar83._8_4_ = -(uint)(iVar91 < auVar58._8_4_);
            auVar83._12_4_ = -(uint)(iVar92 < auVar58._12_4_);
            auVar99._4_4_ = auVar83._0_4_;
            auVar99._0_4_ = auVar83._0_4_;
            auVar99._8_4_ = auVar83._8_4_;
            auVar99._12_4_ = auVar83._8_4_;
            iVar106 = -(uint)(auVar58._4_4_ == iVar68);
            iVar110 = -(uint)(auVar58._12_4_ == iVar92);
            auVar17._4_4_ = iVar106;
            auVar17._0_4_ = iVar106;
            auVar17._8_4_ = iVar110;
            auVar17._12_4_ = iVar110;
            auVar108._4_4_ = auVar83._4_4_;
            auVar108._0_4_ = auVar83._4_4_;
            auVar108._8_4_ = auVar83._12_4_;
            auVar108._12_4_ = auVar83._12_4_;
            auVar58 = auVar17 & auVar99 | auVar108;
            auVar58 = packssdw(auVar58,auVar58);
            auVar7._8_4_ = 0xffffffff;
            auVar7._0_8_ = 0xffffffffffffffff;
            auVar7._12_4_ = 0xffffffff;
            auVar58 = packssdw(auVar58 ^ auVar7,auVar58 ^ auVar7);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)(lVar44 + 0xcb + lVar48) = 1;
            }
            auVar58 = pshufhw(auVar58,auVar99,0x84);
            auVar18._4_4_ = iVar106;
            auVar18._0_4_ = iVar106;
            auVar18._8_4_ = iVar110;
            auVar18._12_4_ = iVar110;
            auVar93 = pshufhw(auVar83,auVar18,0x84);
            auVar89 = pshufhw(auVar58,auVar108,0x84);
            auVar61._8_4_ = 0xffffffff;
            auVar61._0_8_ = 0xffffffffffffffff;
            auVar61._12_4_ = 0xffffffff;
            auVar61 = (auVar89 | auVar93 & auVar58) ^ auVar61;
            auVar58 = packssdw(auVar61,auVar61);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._6_2_ >> 8 & 1) != 0) {
              *(undefined1 *)(lVar44 + 0xeb + lVar48) = 1;
            }
            auVar58 = auVar75 ^ auVar26;
            auVar84._0_4_ = -(uint)(iVar42 < auVar58._0_4_);
            auVar84._4_4_ = -(uint)(iVar68 < auVar58._4_4_);
            auVar84._8_4_ = -(uint)(iVar91 < auVar58._8_4_);
            auVar84._12_4_ = -(uint)(iVar92 < auVar58._12_4_);
            auVar19._4_4_ = auVar84._0_4_;
            auVar19._0_4_ = auVar84._0_4_;
            auVar19._8_4_ = auVar84._8_4_;
            auVar19._12_4_ = auVar84._8_4_;
            auVar93 = pshuflw(auVar108,auVar19,0xe8);
            auVar62._0_4_ = -(uint)(auVar58._0_4_ == iVar42);
            auVar62._4_4_ = -(uint)(auVar58._4_4_ == iVar68);
            auVar62._8_4_ = -(uint)(auVar58._8_4_ == iVar91);
            auVar62._12_4_ = -(uint)(auVar58._12_4_ == iVar92);
            auVar100._4_4_ = auVar62._4_4_;
            auVar100._0_4_ = auVar62._4_4_;
            auVar100._8_4_ = auVar62._12_4_;
            auVar100._12_4_ = auVar62._12_4_;
            auVar58 = pshuflw(auVar62,auVar100,0xe8);
            auVar101._4_4_ = auVar84._4_4_;
            auVar101._0_4_ = auVar84._4_4_;
            auVar101._8_4_ = auVar84._12_4_;
            auVar101._12_4_ = auVar84._12_4_;
            auVar89 = pshuflw(auVar84,auVar101,0xe8);
            auVar85._8_4_ = 0xffffffff;
            auVar85._0_8_ = 0xffffffffffffffff;
            auVar85._12_4_ = 0xffffffff;
            auVar85 = (auVar89 | auVar58 & auVar93) ^ auVar85;
            auVar89 = packssdw(auVar85,auVar85);
            auVar58 = packsswb(auVar58 & auVar93,auVar89);
            if ((auVar58 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined1 *)(lVar44 + 0x10b + lVar48) = 1;
            }
            auVar20._4_4_ = auVar84._0_4_;
            auVar20._0_4_ = auVar84._0_4_;
            auVar20._8_4_ = auVar84._8_4_;
            auVar20._12_4_ = auVar84._8_4_;
            auVar101 = auVar100 & auVar20 | auVar101;
            auVar89 = packssdw(auVar101,auVar101);
            auVar8._8_4_ = 0xffffffff;
            auVar8._0_8_ = 0xffffffffffffffff;
            auVar8._12_4_ = 0xffffffff;
            auVar89 = packssdw(auVar89 ^ auVar8,auVar89 ^ auVar8);
            auVar58 = packsswb(auVar58,auVar89);
            if ((auVar58._8_2_ >> 8 & 1) != 0) {
              *(undefined1 *)(lVar44 + 299 + lVar48) = 1;
            }
            auVar58 = auVar73 ^ auVar26;
            auVar86._0_4_ = -(uint)(iVar42 < auVar58._0_4_);
            auVar86._4_4_ = -(uint)(iVar68 < auVar58._4_4_);
            auVar86._8_4_ = -(uint)(iVar91 < auVar58._8_4_);
            auVar86._12_4_ = -(uint)(iVar92 < auVar58._12_4_);
            auVar102._4_4_ = auVar86._0_4_;
            auVar102._0_4_ = auVar86._0_4_;
            auVar102._8_4_ = auVar86._8_4_;
            auVar102._12_4_ = auVar86._8_4_;
            iVar106 = -(uint)(auVar58._4_4_ == iVar68);
            iVar110 = -(uint)(auVar58._12_4_ == iVar92);
            auVar21._4_4_ = iVar106;
            auVar21._0_4_ = iVar106;
            auVar21._8_4_ = iVar110;
            auVar21._12_4_ = iVar110;
            auVar109._4_4_ = auVar86._4_4_;
            auVar109._0_4_ = auVar86._4_4_;
            auVar109._8_4_ = auVar86._12_4_;
            auVar109._12_4_ = auVar86._12_4_;
            auVar58 = auVar21 & auVar102 | auVar109;
            auVar58 = packssdw(auVar58,auVar58);
            auVar9._8_4_ = 0xffffffff;
            auVar9._0_8_ = 0xffffffffffffffff;
            auVar9._12_4_ = 0xffffffff;
            auVar58 = packssdw(auVar58 ^ auVar9,auVar58 ^ auVar9);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined1 *)(lVar44 + 0x14b + lVar48) = 1;
            }
            auVar58 = pshufhw(auVar58,auVar102,0x84);
            auVar22._4_4_ = iVar106;
            auVar22._0_4_ = iVar106;
            auVar22._8_4_ = iVar110;
            auVar22._12_4_ = iVar110;
            auVar93 = pshufhw(auVar86,auVar22,0x84);
            auVar89 = pshufhw(auVar58,auVar109,0x84);
            auVar63._8_4_ = 0xffffffff;
            auVar63._0_8_ = 0xffffffffffffffff;
            auVar63._12_4_ = 0xffffffff;
            auVar63 = (auVar89 | auVar93 & auVar58) ^ auVar63;
            auVar58 = packssdw(auVar63,auVar63);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._10_2_ >> 8 & 1) != 0) {
              *(undefined1 *)(lVar44 + 0x16b + lVar48) = 1;
            }
            auVar58 = auVar71 ^ auVar26;
            auVar87._0_4_ = -(uint)(iVar42 < auVar58._0_4_);
            auVar87._4_4_ = -(uint)(iVar68 < auVar58._4_4_);
            auVar87._8_4_ = -(uint)(iVar91 < auVar58._8_4_);
            auVar87._12_4_ = -(uint)(iVar92 < auVar58._12_4_);
            auVar23._4_4_ = auVar87._0_4_;
            auVar23._0_4_ = auVar87._0_4_;
            auVar23._8_4_ = auVar87._8_4_;
            auVar23._12_4_ = auVar87._8_4_;
            auVar93 = pshuflw(auVar109,auVar23,0xe8);
            auVar64._0_4_ = -(uint)(auVar58._0_4_ == iVar42);
            auVar64._4_4_ = -(uint)(auVar58._4_4_ == iVar68);
            auVar64._8_4_ = -(uint)(auVar58._8_4_ == iVar91);
            auVar64._12_4_ = -(uint)(auVar58._12_4_ == iVar92);
            auVar103._4_4_ = auVar64._4_4_;
            auVar103._0_4_ = auVar64._4_4_;
            auVar103._8_4_ = auVar64._12_4_;
            auVar103._12_4_ = auVar64._12_4_;
            auVar58 = pshuflw(auVar64,auVar103,0xe8);
            auVar104._4_4_ = auVar87._4_4_;
            auVar104._0_4_ = auVar87._4_4_;
            auVar104._8_4_ = auVar87._12_4_;
            auVar104._12_4_ = auVar87._12_4_;
            auVar89 = pshuflw(auVar87,auVar104,0xe8);
            auVar10._8_4_ = 0xffffffff;
            auVar10._0_8_ = 0xffffffffffffffff;
            auVar10._12_4_ = 0xffffffff;
            auVar58 = packssdw(auVar58 & auVar93,(auVar89 | auVar58 & auVar93) ^ auVar10);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined1 *)(lVar44 + 0x18b + lVar48) = 1;
            }
            auVar24._4_4_ = auVar87._0_4_;
            auVar24._0_4_ = auVar87._0_4_;
            auVar24._8_4_ = auVar87._8_4_;
            auVar24._12_4_ = auVar87._8_4_;
            auVar104 = auVar103 & auVar24 | auVar104;
            auVar89 = packssdw(auVar104,auVar104);
            auVar11._8_4_ = 0xffffffff;
            auVar11._0_8_ = 0xffffffffffffffff;
            auVar11._12_4_ = 0xffffffff;
            auVar58 = packssdw(auVar58,auVar89 ^ auVar11);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._12_2_ >> 8 & 1) != 0) {
              *(undefined1 *)(lVar44 + 0x1ab + lVar48) = 1;
            }
            auVar58 = auVar69 ^ auVar26;
            auVar88._0_4_ = -(uint)(iVar42 < auVar58._0_4_);
            auVar88._4_4_ = -(uint)(iVar68 < auVar58._4_4_);
            auVar88._8_4_ = -(uint)(iVar91 < auVar58._8_4_);
            auVar88._12_4_ = -(uint)(iVar92 < auVar58._12_4_);
            auVar105._4_4_ = auVar88._0_4_;
            auVar105._0_4_ = auVar88._0_4_;
            auVar105._8_4_ = auVar88._8_4_;
            auVar105._12_4_ = auVar88._8_4_;
            iVar42 = -(uint)(auVar58._4_4_ == iVar68);
            iVar68 = -(uint)(auVar58._12_4_ == iVar92);
            auVar90._4_4_ = iVar42;
            auVar90._0_4_ = iVar42;
            auVar90._8_4_ = iVar68;
            auVar90._12_4_ = iVar68;
            auVar65._4_4_ = auVar88._4_4_;
            auVar65._0_4_ = auVar88._4_4_;
            auVar65._8_4_ = auVar88._12_4_;
            auVar65._12_4_ = auVar88._12_4_;
            auVar65 = auVar90 & auVar105 | auVar65;
            auVar58 = packssdw(auVar65,auVar65);
            auVar12._8_4_ = 0xffffffff;
            auVar12._0_8_ = 0xffffffffffffffff;
            auVar12._12_4_ = 0xffffffff;
            auVar58 = packssdw(auVar58 ^ auVar12,auVar58 ^ auVar12);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined1 *)(lVar44 + 0x1cb + lVar48) = 1;
            }
            auVar58 = pshufhw(auVar58,auVar105,0x84);
            in_XMM11 = pshufhw(auVar88,auVar90,0x84);
            in_XMM11 = in_XMM11 & auVar58;
            auVar25._4_4_ = auVar88._4_4_;
            auVar25._0_4_ = auVar88._4_4_;
            auVar25._8_4_ = auVar88._12_4_;
            auVar25._12_4_ = auVar88._12_4_;
            auVar58 = pshufhw(auVar58,auVar25,0x84);
            auVar66._8_4_ = 0xffffffff;
            auVar66._0_8_ = 0xffffffffffffffff;
            auVar66._12_4_ = 0xffffffff;
            auVar66 = (auVar58 | in_XMM11) ^ auVar66;
            auVar58 = packssdw(auVar66,auVar66);
            auVar58 = packsswb(auVar58,auVar58);
            if ((auVar58._14_2_ >> 8 & 1) != 0) {
              *(undefined1 *)(lVar44 + 0x1eb + lVar48) = 1;
            }
            lVar53 = (long)DAT_001852a0;
            lVar70 = auVar79._8_8_;
            auVar79._0_8_ = auVar79._0_8_ + lVar53;
            lVar67 = DAT_001852a0._8_8_;
            auVar79._8_8_ = lVar70 + lVar67;
            lVar70 = auVar78._8_8_;
            auVar78._0_8_ = auVar78._0_8_ + lVar53;
            auVar78._8_8_ = lVar70 + lVar67;
            lVar70 = auVar77._8_8_;
            auVar77._0_8_ = auVar77._0_8_ + lVar53;
            auVar77._8_8_ = lVar70 + lVar67;
            lVar70 = auVar76._8_8_;
            auVar76._0_8_ = auVar76._0_8_ + lVar53;
            auVar76._8_8_ = lVar70 + lVar67;
            lVar70 = auVar75._8_8_;
            auVar75._0_8_ = auVar75._0_8_ + lVar53;
            auVar75._8_8_ = lVar70 + lVar67;
            lVar70 = auVar73._8_8_;
            auVar73._0_8_ = auVar73._0_8_ + lVar53;
            auVar73._8_8_ = lVar70 + lVar67;
            lVar70 = auVar71._8_8_;
            auVar71._0_8_ = auVar71._0_8_ + lVar53;
            auVar71._8_8_ = lVar70 + lVar67;
            lVar70 = auVar69._8_8_;
            auVar69._0_8_ = auVar69._0_8_ + lVar53;
            auVar69._8_8_ = lVar70 + lVar67;
            lVar48 = lVar48 + 0x200;
            auVar58 = _DAT_001852a0;
          } while ((ulong)(uVar39 >> 4) << 9 != lVar48);
        }
        MenuItem("Exit","Alt+F4",false,true);
        EndMenu();
      }
      EndMenuBar();
    }
    local_50 = p_open;
    if (0 < ShowExampleAppDocuments(bool*)::app) {
      lVar48 = 8;
      lVar44 = 0;
      do {
        lVar53 = DAT_001b4398;
        if (lVar44 != 0) {
          SameLine(0.0,-1.0);
        }
        puVar47 = (undefined8 *)(lVar48 + lVar53 + -8);
        PushID(puVar47);
        bVar27 = Checkbox((char *)*puVar47,(bool *)(lVar48 + lVar53));
        if ((bVar27) && (*(bool *)(lVar48 + lVar53) == false)) {
          *(undefined1 *)(lVar53 + lVar48) = 0;
          *(undefined1 *)(lVar53 + 2 + lVar48) = 0;
        }
        PopID();
        lVar44 = lVar44 + 1;
        lVar48 = lVar48 + 0x20;
      } while (lVar44 < ShowExampleAppDocuments(bool*)::app);
    }
    Separator();
    bVar27 = BeginTabBar("##tabs",0x41);
    if (bVar27) {
      if (0 < ShowExampleAppDocuments(bool*)::app) {
        lVar44 = 9;
        lVar48 = 0;
        do {
          lVar53 = DAT_001b4398;
          if ((*(char *)(DAT_001b4398 + -1 + lVar44) == '\0') &&
             (*(char *)(DAT_001b4398 + lVar44) == '\x01')) {
            SetTabItemClosed(*(char **)(DAT_001b4398 + -9 + lVar44));
          }
          *(undefined1 *)(lVar53 + lVar44) = *(undefined1 *)(lVar53 + -1 + lVar44);
          lVar48 = lVar48 + 1;
          lVar44 = lVar44 + 0x20;
        } while (lVar48 < ShowExampleAppDocuments(bool*)::app);
      }
      if (0 < ShowExampleAppDocuments(bool*)::app) {
        lVar48 = 8;
        lVar44 = 0;
        do {
          lVar53 = DAT_001b4398;
          if (*(char *)(DAT_001b4398 + lVar48) == '\x01') {
            bVar27 = BeginTabItem(*(char **)(DAT_001b4398 + -8 + lVar48),
                                  (bool *)(DAT_001b4398 + lVar48),
                                  (uint)*(byte *)(DAT_001b4398 + 2 + lVar48));
            if ((*(char *)(lVar53 + lVar48) == '\0') && (*(char *)(lVar53 + 2 + lVar48) == '\x01'))
            {
              *(undefined1 *)(lVar53 + lVar48) = 1;
              *(undefined1 *)(lVar53 + 3 + lVar48) = 1;
            }
            doc = (MyDocument *)(lVar53 + lVar48 + -8);
            MyDocument::DisplayContextMenu(doc);
            if (bVar27) {
              MyDocument::DisplayContents(doc);
              EndTabItem();
            }
          }
          lVar44 = lVar44 + 1;
          lVar48 = lVar48 + 0x20;
        } while (lVar44 < ShowExampleAppDocuments(bool*)::app);
      }
      EndTabBar();
    }
    p_open = local_50;
    if (ShowExampleAppDocuments(bool*)::close_queue == '\0') {
      ShowDemoWindow();
    }
    if ((ShowExampleAppDocuments(bool*)::close_queue == 0) &&
       (0 < ShowExampleAppDocuments(bool*)::app)) {
      lVar44 = 0;
      lVar48 = 0;
      do {
        lVar53 = DAT_001b4398;
        if (*(char *)(DAT_001b4398 + 0xb + lVar44) == '\x01') {
          *(undefined1 *)(DAT_001b4398 + 0xb + lVar44) = 0;
          if (ShowExampleAppDocuments(bool*)::close_queue == DAT_001b43ac) {
            if (DAT_001b43ac == 0) {
              iVar42 = 8;
            }
            else {
              iVar42 = DAT_001b43ac / 2 + DAT_001b43ac;
            }
            iVar68 = ShowExampleAppDocuments(bool*)::close_queue + 1;
            if (ShowExampleAppDocuments(bool*)::close_queue + 1 < iVar42) {
              iVar68 = iVar42;
            }
            if (DAT_001b43ac < iVar68) {
              pvVar33 = MemAlloc((long)iVar68 << 3);
              if (DAT_001b43b0 != (void *)0x0) {
                memcpy(pvVar33,DAT_001b43b0,(long)ShowExampleAppDocuments(bool*)::close_queue << 3);
                MemFree(DAT_001b43b0);
              }
              _close_queue = CONCAT44(iVar68,ShowExampleAppDocuments(bool*)::close_queue);
              DAT_001b43b0 = pvVar33;
            }
          }
          *(long *)((long)DAT_001b43b0 + (long)ShowExampleAppDocuments(bool*)::close_queue * 8) =
               lVar53 + lVar44;
          ShowExampleAppDocuments(bool*)::close_queue =
               ShowExampleAppDocuments(bool*)::close_queue + 1;
        }
        lVar48 = lVar48 + 1;
        lVar44 = lVar44 + 0x20;
      } while (lVar48 < ShowExampleAppDocuments(bool*)::app);
    }
    pvVar33 = DAT_001b43b0;
    uVar72 = _close_queue & 0xffffffff;
    if (uVar72 != 0) {
      if (0 < ShowExampleAppDocuments(bool*)::close_queue) {
        uVar40 = 0;
        iVar42 = 0;
        do {
          iVar42 = iVar42 + (uint)*(byte *)(*(long *)((long)DAT_001b43b0 + uVar40 * 8) + 10);
          uVar40 = uVar40 + 1;
        } while (uVar72 != uVar40);
        if (iVar42 != 0) {
          bVar27 = IsPopupOpen("Save?",0);
          if (!bVar27) {
            OpenPopup("Save?",0);
          }
          bVar27 = BeginPopupModal("Save?",(bool *)0x0,0x40);
          if (bVar27) {
            Text("Save change to the following items?");
            fVar50 = GetTextLineHeightWithSpacing();
            id = GetID("frame");
            local_d8._4_4_ = fVar50 * 6.25;
            local_d8._0_4_ = -1.1754944e-38;
            bVar27 = BeginChildFrame(id,(ImVec2 *)local_d8,0);
            if (bVar27) {
              if (0 < ShowExampleAppDocuments(bool*)::close_queue) {
                lVar44 = 0;
                do {
                  puVar47 = *(undefined8 **)((long)DAT_001b43b0 + lVar44 * 8);
                  if (*(char *)((long)puVar47 + 10) == '\x01') {
                    Text("%s",*puVar47);
                  }
                  lVar44 = lVar44 + 1;
                } while (lVar44 < ShowExampleAppDocuments(bool*)::close_queue);
              }
              EndChildFrame();
            }
            fVar50 = GetFontSize();
            local_d8._4_4_ = 0;
            local_d8._0_4_ = fVar50 * 7.0;
            bVar27 = Button("Yes",(ImVec2 *)local_d8);
            pvVar33 = DAT_001b43b0;
            if (bVar27) {
              lVar44 = (long)ShowExampleAppDocuments(bool*)::close_queue;
              if (0 < lVar44) {
                lVar48 = 0;
                do {
                  lVar53 = *(long *)((long)pvVar33 + lVar48 * 8);
                  if (*(char *)(lVar53 + 10) == '\x01') {
                    *(undefined1 *)(lVar53 + 10) = 0;
                  }
                  *(undefined1 *)(lVar53 + 8) = 0;
                  *(undefined1 *)(lVar53 + 10) = 0;
                  lVar48 = lVar48 + 1;
                } while (lVar44 != lVar48);
              }
              if (DAT_001b43b0 != (void *)0x0) {
                _close_queue = 0;
                MemFree(DAT_001b43b0);
                DAT_001b43b0 = (void *)0x0;
              }
              CloseCurrentPopup();
            }
            SameLine(0.0,-1.0);
            bVar27 = Button("No",(ImVec2 *)local_d8);
            pvVar33 = DAT_001b43b0;
            if (bVar27) {
              lVar44 = (long)ShowExampleAppDocuments(bool*)::close_queue;
              if (0 < lVar44) {
                lVar48 = 0;
                do {
                  lVar53 = *(long *)((long)pvVar33 + lVar48 * 8);
                  *(undefined1 *)(lVar53 + 8) = 0;
                  *(undefined1 *)(lVar53 + 10) = 0;
                  lVar48 = lVar48 + 1;
                } while (lVar44 != lVar48);
              }
              if (DAT_001b43b0 != (void *)0x0) {
                _close_queue = 0;
                MemFree(DAT_001b43b0);
                DAT_001b43b0 = (void *)0x0;
              }
              CloseCurrentPopup();
            }
            SameLine(0.0,-1.0);
            bVar27 = Button("Cancel",(ImVec2 *)local_d8);
            if (bVar27) {
              if (DAT_001b43b0 != (void *)0x0) {
                _close_queue = 0;
                MemFree(DAT_001b43b0);
                DAT_001b43b0 = (void *)0x0;
              }
              CloseCurrentPopup();
            }
            EndPopup();
          }
          goto LAB_0013a0c2;
        }
        if (0 < ShowExampleAppDocuments(bool*)::close_queue) {
          uVar40 = 0;
          do {
            lVar44 = *(long *)((long)pvVar33 + uVar40 * 8);
            *(undefined1 *)(lVar44 + 8) = 0;
            *(undefined1 *)(lVar44 + 10) = 0;
            uVar40 = uVar40 + 1;
          } while (uVar72 != uVar40);
        }
      }
      if (DAT_001b43b0 != (void *)0x0) {
        _close_queue = 0;
        MemFree(DAT_001b43b0);
        DAT_001b43b0 = (void *)0x0;
      }
    }
  }
LAB_0013a0c2:
  End();
LAB_0013a0c7:
  if (ShowDemoWindow::show_app_console == true) {
    if ((ShowExampleAppConsole(bool*)::console == '\0') &&
       (iVar42 = __cxa_guard_acquire(&ShowExampleAppConsole(bool*)::console), iVar42 != 0)) {
      ExampleAppConsole::ExampleAppConsole
                ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console);
      __cxa_atexit(ExampleAppConsole::~ExampleAppConsole,ShowExampleAppConsole(bool*)::console,
                   &__dso_handle);
      __cxa_guard_release(&ShowExampleAppConsole(bool*)::console);
    }
    ExampleAppConsole::Draw
              ((ExampleAppConsole *)ShowExampleAppConsole(bool*)::console,"Example: Console",
               &ShowDemoWindow::show_app_console);
  }
  if (ShowDemoWindow::show_app_log == true) {
    if ((ShowExampleAppLog(bool*)::log == '\0') &&
       (iVar42 = __cxa_guard_acquire(&ShowExampleAppLog(bool*)::log), iVar42 != 0)) {
      ExampleAppLog::ExampleAppLog((ExampleAppLog *)ShowExampleAppLog(bool*)::log);
      __cxa_atexit(ExampleAppLog::~ExampleAppLog,ShowExampleAppLog(bool*)::log,&__dso_handle);
      __cxa_guard_release(&ShowExampleAppLog(bool*)::log);
    }
    local_d8._0_4_ = 500.0;
    local_d8._4_4_ = 400.0;
    local_50 = p_open;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    Begin("Example: Log",&ShowDemoWindow::show_app_log,0);
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x1b2d,"Examples/Log",GImGuiDemoMarkerCallbackUserData);
    }
    bVar27 = SmallButton("[Debug] Add 5 entries");
    if (bVar27) {
      iVar42 = 5;
      do {
        uVar39 = GetFrameCount();
        GetTime();
        ExampleAppLog::AddLog
                  ((ExampleAppLog *)ShowExampleAppLog(bool*)::log,
                   "[%05d] [%s] Hello, current time is %.1f, here\'s a word: \'%s\'\n",(ulong)uVar39
                  );
        ShowExampleAppLog(bool*)::counter = ShowExampleAppLog(bool*)::counter + 1;
        iVar42 = iVar42 + -1;
      } while (iVar42 != 0);
    }
    End();
    ExampleAppLog::Draw((ExampleAppLog *)ShowExampleAppLog(bool*)::log,"Example: Log",
                        &ShowDemoWindow::show_app_log);
    p_open = local_50;
  }
  if (ShowDemoWindow::show_app_layout == true) {
    local_d8._0_4_ = 500.0;
    local_d8._4_4_ = 440.0;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    bVar27 = Begin("Example: Simple layout",&ShowDemoWindow::show_app_layout,0x400);
    if (bVar27) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1b4c,"Examples/Simple layout",GImGuiDemoMarkerCallbackUserData);
      }
      bVar27 = BeginMenuBar();
      if (bVar27) {
        bVar27 = BeginMenu("File",true);
        if (bVar27) {
          bVar27 = MenuItem("Close",(char *)0x0,false,true);
          if (bVar27) {
            ShowDemoWindow::show_app_layout = false;
          }
          EndMenu();
        }
        EndMenuBar();
      }
      local_d8 = SUB168(ZEXT416(0x43160000),0);
      BeginChild("left pane",(ImVec2 *)local_d8,true,0);
      uVar72 = 0;
      do {
        iVar42 = (int)uVar72;
        sprintf((char *)local_d8,"MyObject %d",uVar72);
        local_158.x = 0.0;
        local_158.y = 0.0;
        bVar27 = Selectable((char *)local_d8,iVar42 == ShowExampleAppLayout(bool*)::selected,0,
                            &local_158);
        if (bVar27) {
          ShowExampleAppLayout(bool*)::selected = iVar42;
        }
        uVar72 = (ulong)(iVar42 + 1U);
      } while (iVar42 + 1U != 100);
      EndChild();
      SameLine(0.0,-1.0);
      BeginGroup();
      fVar50 = GetFrameHeightWithSpacing();
      local_d8 = (undefined1  [8])((ulong)((uint)fVar50 ^ (uint)DAT_0017b310) << 0x20);
      BeginChild("item view",(ImVec2 *)local_d8,false,0);
      Text("MyObject: %d");
      Separator();
      bVar27 = BeginTabBar("##Tabs",0);
      if (bVar27) {
        bVar27 = BeginTabItem("Description",(bool *)0x0,0);
        if (bVar27) {
          TextWrapped(
                     "Lorem ipsum dolor sit amet, consectetur adipiscing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua. "
                     );
          EndTabItem();
        }
        bVar27 = BeginTabItem("Details",(bool *)0x0,0);
        if (bVar27) {
          Text("ID: 0123456789");
          EndTabItem();
        }
        EndTabBar();
      }
      EndChild();
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      Button("Revert",(ImVec2 *)local_d8);
      SameLine(0.0,-1.0);
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      Button("Save",(ImVec2 *)local_d8);
      EndGroup();
    }
    End();
  }
  if (ShowDemoWindow::show_app_property_editor == true) {
    local_d8._0_4_ = 430.0;
    local_d8._4_4_ = 450.0;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    bVar27 = Begin("Example: Property editor",&ShowDemoWindow::show_app_property_editor,0);
    if (bVar27) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1bc1,"Examples/Property Editor",GImGuiDemoMarkerCallbackUserData);
      }
      HelpMarker(
                "This example shows how you may implement a property editor using two columns.\nAll objects/fields data are dummies here.\nRemember that in many simple cases, you can use ImGui::SameLine(xxx) to position\nyour cursor horizontally instead of using the Columns() API."
                );
      local_d8._0_4_ = 2.0;
      local_d8._4_4_ = 2.0;
      PushStyleVar(0xb,(ImVec2 *)local_d8);
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar27 = BeginTable("split",2,0x501,(ImVec2 *)local_d8,0.0);
      if (bVar27) {
        iVar42 = 0;
        do {
          ShowPlaceholderObject("Object",iVar42);
          iVar42 = iVar42 + 1;
        } while (iVar42 != 4);
        EndTable();
      }
      PopStyleVar(1);
    }
    End();
  }
  if (ShowDemoWindow::show_app_long_text == true) {
    local_d8._0_4_ = 520.0;
    local_d8._4_4_ = 600.0;
    SetNextWindowSize((ImVec2 *)local_d8,4);
    bVar27 = Begin("Example: Long text display",&ShowDemoWindow::show_app_long_text,0);
    if (bVar27) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1be5,"Examples/Long text display",GImGuiDemoMarkerCallbackUserData);
      }
      if (ShowExampleAppLongText(bool*)::log == '\0') {
        ShowDemoWindow();
      }
      Text("Printing unusually long amount of text.");
      Combo("Test type",&ShowExampleAppLongText(bool*)::test_type,"Single call to TextUnformatted()"
            ,-1);
      uVar72 = (ulong)(ShowExampleAppLongText(bool*)::log - 1);
      if (ShowExampleAppLongText(bool*)::log == 0) {
        uVar72 = 0;
      }
      Text("Buffer contents: %d lines, %d bytes",(ulong)ShowExampleAppLongText(bool*)::lines,uVar72)
      ;
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar27 = Button("Clear",(ImVec2 *)local_d8);
      if (bVar27) {
        if (DAT_001b4340 != (char *)0x0) {
          _log = 0;
          MemFree(DAT_001b4340);
          DAT_001b4340 = (char *)0x0;
        }
        ShowExampleAppLongText(bool*)::lines = 0;
      }
      SameLine(0.0,-1.0);
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar27 = Button("Add 1000 lines",(ImVec2 *)local_d8);
      if (bVar27) {
        iVar42 = 0;
        do {
          ImGuiTextBuffer::appendf
                    ((ImGuiTextBuffer *)&ShowExampleAppLongText(bool*)::log,
                     "%i The quick brown fox jumps over the lazy dog\n",
                     (ulong)(ShowExampleAppLongText(bool*)::lines + iVar42));
          iVar42 = iVar42 + 1;
        } while (iVar42 != 1000);
        ShowExampleAppLongText(bool*)::lines = ShowExampleAppLongText(bool*)::lines + 1000;
      }
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      BeginChild("Log",(ImVec2 *)local_d8,false,0);
      if (ShowExampleAppLongText(bool*)::test_type == 2) {
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        PushStyleVar(0xe,(ImVec2 *)local_d8);
        if (0 < (int)ShowExampleAppLongText(bool*)::lines) {
          iVar42 = 0;
          do {
            Text("%i The quick brown fox jumps over the lazy dog");
            iVar42 = iVar42 + 1;
          } while (iVar42 < (int)ShowExampleAppLongText(bool*)::lines);
        }
        PopStyleVar(1);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 1) {
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        PushStyleVar(0xe,(ImVec2 *)local_d8);
        ImGuiListClipper::ImGuiListClipper((ImGuiListClipper *)local_d8);
        ImGuiListClipper::Begin
                  ((ImGuiListClipper *)local_d8,ShowExampleAppLongText(bool*)::lines,-1.0);
        while (bVar27 = ImGuiListClipper::Step((ImGuiListClipper *)local_d8), bVar27) {
          for (fVar50 = (float)local_d8._0_4_; (int)fVar50 < (int)local_d8._4_4_;
              fVar50 = (float)((int)fVar50 + 1)) {
            Text("%i The quick brown fox jumps over the lazy dog");
          }
        }
        PopStyleVar(1);
        ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)local_d8);
      }
      else if (ShowExampleAppLongText(bool*)::test_type == 0) {
        pcVar45 = DAT_001b4340 + (long)ShowExampleAppLongText(bool*)::log + -1;
        pcVar46 = DAT_001b4340;
        if (DAT_001b4340 == (char *)0x0) {
          pcVar46 = ImGuiTextBuffer::EmptyString;
          pcVar45 = ImGuiTextBuffer::EmptyString;
        }
        TextUnformatted(pcVar46,pcVar45);
      }
      EndChild();
    }
    End();
  }
  if (ShowDemoWindow::show_app_auto_resize == true) {
    bVar27 = Begin("Example: Auto-resizing window",&ShowDemoWindow::show_app_auto_resize,0x40);
    if (bVar27) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1c23,"Examples/Auto-resizing window",GImGuiDemoMarkerCallbackUserData);
      }
      TextUnformatted("Window will resize every-frame to the size of its content.\nNote that you probably don\'t want to query the window size to\noutput your content because that would create a feedback loop."
                      ,(char *)0x0);
      SliderInt("Number of lines",&ShowExampleAppAutoResize(bool*)::lines,1,0x14,"%d",0);
      if (0 < ShowExampleAppAutoResize(bool*)::lines) {
        uVar72 = 0;
        iVar42 = 0;
        do {
          Text("%*sThis is line %d",uVar72,"");
          iVar42 = iVar42 + 1;
          uVar72 = (ulong)((int)uVar72 + 4);
        } while (iVar42 < ShowExampleAppAutoResize(bool*)::lines);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_constrained_resize == true) {
    local_a8 = "Custom: Fixed Steps (100)";
    local_b8 = "Height 400-500";
    pcStack_b0 = "Custom: Always Square";
    local_c8 = (ImVec2)0x190d99;
    IStack_c0 = (ImVec2)0x190db3;
    local_d8 = (undefined1  [8])0x190d6d;
    IStack_d0 = (ImVec2)0x190d82;
    if (ShowExampleAppConstrainedResize(bool*)::type == 0) {
      local_158.x = -1.0;
      local_158.y = 0.0;
      local_120.x = -1.0;
      local_120.y = 3.4028235e+38;
      SetNextWindowSizeConstraints(&local_158,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 1) {
      local_158.x = 0.0;
      local_158.y = -1.0;
      local_120.x = 3.4028235e+38;
      local_120.y = -1.0;
      SetNextWindowSizeConstraints(&local_158,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 2) {
      local_158.x = 100.0;
      local_158.y = 100.0;
      local_120.x = 3.4028235e+38;
      local_120.y = 3.4028235e+38;
      SetNextWindowSizeConstraints(&local_158,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 3) {
      local_158.x = 400.0;
      local_158.y = -1.0;
      local_120.x = 500.0;
      local_120.y = -1.0;
      SetNextWindowSizeConstraints(&local_158,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 4) {
      local_158.x = -1.0;
      local_158.y = 400.0;
      local_120.x = -1.0;
      local_120.y = 500.0;
      SetNextWindowSizeConstraints(&local_158,&local_120,(ImGuiSizeCallback)0x0,(void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 5) {
      local_158.x = 0.0;
      local_158.y = 0.0;
      local_120.x = 3.4028235e+38;
      local_120.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                (&local_158,&local_120,ShowExampleAppConstrainedResize::CustomConstraints::Square,
                 (void *)0x0);
    }
    if (ShowExampleAppConstrainedResize(bool*)::type == 6) {
      local_158.x = 0.0;
      local_158.y = 0.0;
      local_120.x = 3.4028235e+38;
      local_120.y = 3.4028235e+38;
      SetNextWindowSizeConstraints
                (&local_158,&local_120,ShowExampleAppConstrainedResize::CustomConstraints::Step,
                 &DAT_00000064);
    }
    bVar27 = Begin("Example: Constrained Resize",&ShowDemoWindow::show_app_constrained_resize,
                   (uint)ShowExampleAppConstrainedResize(bool*)::auto_resize << 6);
    if (bVar27) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1c57,"Examples/Constrained Resizing window",GImGuiDemoMarkerCallbackUserData);
      }
      local_158.x = 0.0;
      local_158.y = 0.0;
      bVar27 = Button("200x200",&local_158);
      if (bVar27) {
        local_158.x = 200.0;
        local_158.y = 200.0;
        SetWindowSize(&local_158,0);
      }
      SameLine(0.0,-1.0);
      local_158.x = 0.0;
      local_158.y = 0.0;
      bVar27 = Button("500x500",&local_158);
      if (bVar27) {
        local_158.x = 500.0;
        local_158.y = 500.0;
        SetWindowSize(&local_158,0);
      }
      SameLine(0.0,-1.0);
      local_158.x = 0.0;
      local_158.y = 0.0;
      bVar27 = Button("800x200",&local_158);
      if (bVar27) {
        local_158.x = 800.0;
        local_158.y = 200.0;
        SetWindowSize(&local_158,0);
      }
      SetNextItemWidth(200.0);
      Combo("Constraint",&ShowExampleAppConstrainedResize(bool*)::type,(char **)local_d8,7,-1);
      SetNextItemWidth(200.0);
      DragInt("Lines",&ShowExampleAppConstrainedResize(bool*)::display_lines,0.2,1,100,"%d",0);
      Checkbox("Auto-resize",(bool *)&ShowExampleAppConstrainedResize(bool*)::auto_resize);
      if (0 < ShowExampleAppConstrainedResize(bool*)::display_lines) {
        uVar72 = 0;
        iVar42 = 0;
        do {
          Text("%*sHello, sailor! Making this line long enough for the example.",uVar72,"");
          iVar42 = iVar42 + 1;
          uVar72 = (ulong)((int)uVar72 + 4);
        } while (iVar42 < ShowExampleAppConstrainedResize(bool*)::display_lines);
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_simple_overlay == true) {
    pIVar34 = GetIO();
    if (ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff) {
      flags = 0xc116b;
    }
    else {
      pIVar35 = GetMainViewport();
      uVar39 = -(uint)((ShowExampleAppSimpleOverlay(bool*)::corner & 1) == 0);
      uVar74 = -(uint)((ShowExampleAppSimpleOverlay(bool*)::corner & 2) == 0);
      fVar50 = (pIVar35->WorkPos).x;
      fVar52 = (pIVar35->WorkPos).y;
      local_d8 = (undefined1  [8])
                 (CONCAT44(~uVar74 & (uint)((pIVar35->WorkSize).y + fVar52 + -10.0),
                           ~uVar39 & (uint)((pIVar35->WorkSize).x + fVar50 + -10.0)) |
                 CONCAT44((uint)(fVar52 + 10.0) & uVar74,(uint)(fVar50 + 10.0) & uVar39));
      uVar72 = ~CONCAT44(uVar74,uVar39) & DAT_0017b060;
      local_158.x = (float)uVar72;
      local_158.y = (float)(uVar72 >> 0x20);
      SetNextWindowPos((ImVec2 *)local_d8,1,&local_158);
      flags = 0xc116f;
    }
    SetNextWindowBgAlpha(0.35);
    bVar27 = Begin("Example: Simple overlay",&ShowDemoWindow::show_app_simple_overlay,flags);
    if (bVar27) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1c82,"Examples/Simple Overlay",GImGuiDemoMarkerCallbackUserData);
      }
      Text("Simple overlay\nin the corner of the screen.\n(right-click to change position)");
      Separator();
      bVar27 = IsMousePosValid((ImVec2 *)0x0);
      if (bVar27) {
        Text("Mouse Position: (%.1f,%.1f)",(double)(pIVar34->MousePos).x);
      }
      else {
        Text("Mouse Position: <invalid>");
      }
      bVar27 = BeginPopupContextWindow((char *)0x0,1);
      if (bVar27) {
        bVar27 = MenuItem("Custom",(char *)0x0,
                          ShowExampleAppSimpleOverlay(bool*)::corner == 0xffffffff,true);
        if (bVar27) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0xffffffff;
        }
        bVar27 = MenuItem("Top-left",(char *)0x0,ShowExampleAppSimpleOverlay(bool*)::corner == 0,
                          true);
        if (bVar27) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 0;
        }
        bVar27 = MenuItem("Top-right",(char *)0x0,ShowExampleAppSimpleOverlay(bool*)::corner == 1,
                          true);
        if (bVar27) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 1;
        }
        bVar27 = MenuItem("Bottom-left",(char *)0x0,ShowExampleAppSimpleOverlay(bool*)::corner == 2,
                          true);
        if (bVar27) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 2;
        }
        bVar27 = MenuItem("Bottom-right",(char *)0x0,ShowExampleAppSimpleOverlay(bool*)::corner == 3
                          ,true);
        if (bVar27) {
          ShowExampleAppSimpleOverlay(bool*)::corner = 3;
        }
        bVar27 = MenuItem("Close",(char *)0x0,false,true);
        if (bVar27) {
          ShowDemoWindow::show_app_simple_overlay = false;
        }
        EndPopup();
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_fullscreen == true) {
    pIVar35 = GetMainViewport();
    local_d8._0_4_ = 0.0;
    local_d8._4_4_ = 0.0;
    SetNextWindowPos(&pIVar35->Pos + (ulong)ShowExampleAppFullscreen(bool*)::use_work_area * 2,0,
                     (ImVec2 *)local_d8);
    SetNextWindowSize(&pIVar35->Size + (ulong)ShowExampleAppFullscreen(bool*)::use_work_area * 2,0);
    bVar27 = Begin("Example: Fullscreen window",&ShowDemoWindow::show_app_fullscreen,
                   ShowExampleAppFullscreen(bool*)::flags);
    if (bVar27) {
      Checkbox("Use work area instead of main area",
               (bool *)&ShowExampleAppFullscreen(bool*)::use_work_area);
      SameLine(0.0,-1.0);
      HelpMarker(
                "Main Area = entire viewport,\nWork Area = entire viewport minus sections used by the main menu bars, task bars etc.\n\nEnable the main-menu bar in Examples menu to see the difference."
                );
      CheckboxFlags("ImGuiWindowFlags_NoBackground",&ShowExampleAppFullscreen(bool*)::flags,0x80);
      CheckboxFlags("ImGuiWindowFlags_NoDecoration",&ShowExampleAppFullscreen(bool*)::flags,0x2b);
      Indent(0.0);
      CheckboxFlags("ImGuiWindowFlags_NoTitleBar",&ShowExampleAppFullscreen(bool*)::flags,1);
      CheckboxFlags("ImGuiWindowFlags_NoCollapse",&ShowExampleAppFullscreen(bool*)::flags,0x20);
      CheckboxFlags("ImGuiWindowFlags_NoScrollbar",&ShowExampleAppFullscreen(bool*)::flags,8);
      Unindent(0.0);
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar27 = Button("Close this window",(ImVec2 *)local_d8);
      if (bVar27) {
        ShowDemoWindow::show_app_fullscreen = false;
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_window_titles == true) {
    pIVar35 = GetMainViewport();
    local_138._0_4_ = (pIVar35->Pos).x + 100.0;
    fVar50 = (pIVar35->Pos).y;
    local_138._4_4_ = fVar50 + 100.0;
    uStack_130 = 0;
    local_d8._4_4_ = fVar50 + 100.0;
    local_d8._0_4_ = local_138._0_4_;
    local_158.x = 0.0;
    local_158.y = 0.0;
    SetNextWindowPos((ImVec2 *)local_d8,4,&local_158);
    Begin("Same title as another window##1",(bool *)0x0,0);
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x1ccd,"Examples/Manipulating window titles",GImGuiDemoMarkerCallbackUserData);
    }
    Text("This is window 1.\nMy title is the same as window 2, but my identifier is unique.");
    End();
    local_d8._4_4_ = fVar50 + 200.0;
    local_d8._0_4_ = local_138._0_4_;
    local_158.x = 0.0;
    local_158.y = 0.0;
    SetNextWindowPos((ImVec2 *)local_d8,4,&local_158);
    Begin("Same title as another window##2",(bool *)0x0,0);
    Text("This is window 2.\nMy title is the same as window 1, but my identifier is unique.");
    End();
    dVar54 = GetTime();
    cVar2 = "|/-\\"[(int)(dVar54 * 4.0) & 3];
    GetFrameCount();
    sprintf(local_d8,"Animated title %c %d###AnimatedTitle",(ulong)(uint)(int)cVar2);
    local_158.y = fVar50 + 300.0;
    local_158.x = local_138._0_4_;
    local_120.x = 0.0;
    local_120.y = 0.0;
    SetNextWindowPos(&local_158,4,&local_120);
    Begin(local_d8,(bool *)0x0,0);
    Text("This window has a changing title.");
    End();
  }
  if (ShowDemoWindow::show_app_custom_rendering == true) {
    bVar27 = Begin("Example: Custom rendering",&ShowDemoWindow::show_app_custom_rendering,0);
    if (bVar27) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1ceb,"Examples/Custom Rendering",GImGuiDemoMarkerCallbackUserData);
      }
      bVar27 = BeginTabBar("##TabBar",0);
      if (bVar27) {
        iVar42 = 0;
        bVar27 = BeginTabItem("Primitives",(bool *)0x0,0);
        local_50 = p_open;
        if (bVar27) {
          fVar50 = GetFontSize();
          PushItemWidth(fVar50 * -15.0);
          pIVar36 = GetWindowDrawList();
          Text("Gradients");
          fVar50 = CalcItemWidth();
          local_120.y = GetFrameHeight();
          local_120.x = fVar50;
          local_d8 = (undefined1  [8])GetCursorScreenPos();
          local_158.x = local_120.x + local_d8._0_4_;
          local_158.y = local_120.y + local_d8._4_4_;
          IVar30 = GetColorU32(0xff000000);
          IVar31 = GetColorU32(0xffffffff);
          ImDrawList::AddRectFilledMultiColor
                    (pIVar36,(ImVec2 *)local_d8,&local_158,IVar30,IVar31,IVar31,IVar30);
          InvisibleButton("##gradient1",&local_120,0);
          local_d8 = (undefined1  [8])GetCursorScreenPos();
          local_158.x = local_120.x + local_d8._0_4_;
          local_158.y = local_120.y + local_d8._4_4_;
          IVar30 = GetColorU32(0xff00ff00);
          IVar31 = GetColorU32(0xff0000ff);
          ImDrawList::AddRectFilledMultiColor
                    (pIVar36,(ImVec2 *)local_d8,&local_158,IVar30,IVar31,IVar31,IVar30);
          InvisibleButton("##gradient2",&local_120,0);
          Text("All primitives");
          DragFloat("Size",&ShowExampleAppCustomRendering(bool*)::sz,0.2,2.0,100.0,"%.0f",0);
          DragFloat("Thickness",&ShowExampleAppCustomRendering(bool*)::thickness,0.05,1.0,8.0,
                    "%.02f",0);
          SliderInt("N-gon sides",&ShowExampleAppCustomRendering(bool*)::ngon_sides,3,0xc,"%d",0);
          Checkbox("##circlesegmentoverride",
                   (bool *)&ShowExampleAppCustomRendering(bool*)::circle_segments_override);
          pIVar37 = GetStyle();
          SameLine(0.0,(pIVar37->ItemInnerSpacing).x);
          bVar27 = SliderInt("Circle segments override",
                             &ShowExampleAppCustomRendering(bool*)::circle_segments_override_v,3,
                             0x28,"%d",0);
          ShowExampleAppCustomRendering(bool*)::circle_segments_override =
               ShowExampleAppCustomRendering(bool*)::circle_segments_override | bVar27;
          Checkbox("##curvessegmentoverride",
                   (bool *)&ShowExampleAppCustomRendering(bool*)::curve_segments_override);
          pIVar37 = GetStyle();
          SameLine(0.0,(pIVar37->ItemInnerSpacing).x);
          bVar27 = SliderInt("Curves segments override",
                             &ShowExampleAppCustomRendering(bool*)::curve_segments_override_v,3,0x28
                             ,"%d",0);
          ShowExampleAppCustomRendering(bool*)::curve_segments_override =
               ShowExampleAppCustomRendering(bool*)::curve_segments_override | bVar27;
          ColorEdit4("Color",(float *)ShowExampleAppCustomRendering(bool*)::colf,0);
          IVar55 = GetCursorScreenPos();
          local_d8 = (undefined1  [8])ShowExampleAppCustomRendering(bool*)::colf._0_8_;
          IStack_d0.x = (float)ShowExampleAppCustomRendering(bool*)::colf._8_4_;
          IStack_d0.y = (float)ShowExampleAppCustomRendering(bool*)::colf._12_4_;
          IVar30 = ColorConvertFloat4ToU32((ImVec4 *)local_d8);
          local_dc = 0;
          if (ShowExampleAppCustomRendering(bool*)::circle_segments_override != 0) {
            local_dc = ShowExampleAppCustomRendering(bool*)::circle_segments_override_v;
          }
          iVar68 = 0;
          if (ShowExampleAppCustomRendering(bool*)::curve_segments_override != 0) {
            iVar68 = ShowExampleAppCustomRendering(bool*)::curve_segments_override_v;
          }
          local_f4 = ShowExampleAppCustomRendering(bool*)::sz / 5.0;
          local_168 = IVar55.x;
          fStack_164 = IVar55.y;
          uStack_15c = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
          local_48.x = local_168 + 4.0;
          local_48.y = fStack_164;
          uStack_40._0_4_ = (undefined4)extraout_XMM0_Qb;
          uStack_40._4_4_ = uStack_15c;
          fVar50 = fStack_164 + 4.0;
          do {
            fVar52 = 1.0;
            if (iVar42 != 0) {
              fVar52 = ShowExampleAppCustomRendering(bool*)::thickness;
            }
            local_138._0_4_ = fVar52;
            fVar51 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
            local_d8._0_4_ = fVar51 + local_48.x;
            local_d8._4_4_ = fVar51 + fVar50;
            ImDrawList::AddNgon(pIVar36,(ImVec2 *)local_d8,fVar51,IVar30,
                                ShowExampleAppCustomRendering(bool*)::ngon_sides,fVar52);
            fVar51 = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_48.x;
            _local_118 = ZEXT416((uint)fVar51);
            fVar52 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
            local_d8._0_4_ = fVar52 + fVar51;
            local_d8._4_4_ = fVar52 + fVar50;
            ImDrawList::AddCircle
                      (pIVar36,(ImVec2 *)local_d8,fVar52,IVar30,local_dc,(float)local_138._0_4_);
            local_d8._0_4_ =
                 ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_;
            _local_118 = ZEXT416((uint)local_d8._0_4_);
            local_d8._4_4_ = fVar50;
            local_158.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
            local_158.y = fVar50 + ShowExampleAppCustomRendering(bool*)::sz;
            ImDrawList::AddRect(pIVar36,(ImVec2 *)local_d8,&local_158,IVar30,0.0,0,
                                (float)local_138._0_4_);
            local_d8._0_4_ =
                 ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_;
            _local_118 = ZEXT416((uint)local_d8._0_4_);
            local_158.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
            local_158.y = fVar50 + ShowExampleAppCustomRendering(bool*)::sz;
            ImDrawList::AddRect(pIVar36,(ImVec2 *)local_d8,&local_158,IVar30,local_f4,0,
                                (float)local_138._0_4_);
            local_d8._0_4_ =
                 ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_;
            _local_118 = ZEXT416((uint)local_d8._0_4_);
            local_158.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
            local_158.y = fVar50 + ShowExampleAppCustomRendering(bool*)::sz;
            ImDrawList::AddRect(pIVar36,(ImVec2 *)local_d8,&local_158,IVar30,local_f4,0x90,
                                (float)local_138._0_4_);
            local_118._0_4_ =
                 (float)local_118._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
            local_158.y = ShowExampleAppCustomRendering(bool*)::sz + fVar50 + -0.5;
            local_118._4_4_ = local_158.y;
            uStack_110._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 0.0 + 0.0;
            uStack_110._4_4_ = ShowExampleAppCustomRendering(bool*)::sz + fStack_164 + 0.0;
            local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + (float)local_118._0_4_
            ;
            local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._0_4_;
            local_e8.y = local_158.y;
            local_e8.x = (float)local_118._0_4_;
            ImDrawList::AddTriangle
                      (pIVar36,(ImVec2 *)local_d8,&local_158,&local_e8,IVar30,(float)local_138._0_4_
                      );
            local_d8._0_4_ =
                 ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_;
            _local_118 = ZEXT416((uint)local_d8._0_4_);
            local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_d8._0_4_;
            local_158.y = fVar50;
            ImDrawList::AddLine(pIVar36,(ImVec2 *)local_d8,&local_158,IVar30,(float)local_138._0_4_)
            ;
            local_158.x = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_;
            local_158.y = ShowExampleAppCustomRendering(bool*)::sz + fVar50;
            uStack_110._0_4_ = (float)local_118._4_4_ + 0.0;
            local_118._4_4_ = local_158.y;
            local_118._0_4_ = local_158.x;
            uStack_110._4_4_ = fStack_164 + 0.0;
            local_d8._0_4_ = local_158.x;
            ImDrawList::AddLine(pIVar36,(ImVec2 *)local_d8,&local_158,IVar30,(float)local_138._0_4_)
            ;
            local_118._0_4_ = (float)local_118._0_4_ + 10.0;
            local_d8._0_4_ = local_118._0_4_;
            local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_118._0_4_;
            local_158.y = ShowExampleAppCustomRendering(bool*)::sz + fVar50;
            ImDrawList::AddLine(pIVar36,(ImVec2 *)local_d8,&local_158,IVar30,(float)local_138._0_4_)
            ;
            local_158.x = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_;
            _local_118 = ZEXT416((uint)local_158.x);
            local_150.y = ShowExampleAppCustomRendering(bool*)::sz * -0.4 + fVar50;
            local_148[0].x = local_158.x + ShowExampleAppCustomRendering(bool*)::sz;
            local_148[0].y = fVar50 + ShowExampleAppCustomRendering(bool*)::sz;
            local_158.y = ShowExampleAppCustomRendering(bool*)::sz * 0.6 + fVar50;
            local_150.x = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + local_158.x;
            ImDrawList::AddBezierQuadratic
                      (pIVar36,&local_158,&local_150,local_148,IVar30,(float)local_138._0_4_,iVar68)
            ;
            local_d8._0_4_ =
                 ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_118._0_4_;
            IStack_d0.y = ShowExampleAppCustomRendering(bool*)::sz * 0.3 + fVar50;
            IStack_d0.x = ShowExampleAppCustomRendering(bool*)::sz * 1.3 + (float)local_d8._0_4_;
            local_c8.y = -ShowExampleAppCustomRendering(bool*)::sz * 0.3 +
                         fVar50 + ShowExampleAppCustomRendering(bool*)::sz;
            local_c8.x = -ShowExampleAppCustomRendering(bool*)::sz * 1.3 +
                         ShowExampleAppCustomRendering(bool*)::sz + (float)local_d8._0_4_;
            IStack_c0.y = fVar50 + ShowExampleAppCustomRendering(bool*)::sz;
            IStack_c0.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_d8._0_4_;
            ImDrawList::AddBezierCubic
                      (pIVar36,(ImVec2 *)local_d8,&IStack_d0,&local_c8,&IStack_c0,IVar30,
                       (float)local_138._0_4_,iVar68);
            fVar50 = fVar50 + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
            iVar42 = iVar42 + 1;
          } while (iVar42 == 1);
          fVar52 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
          local_d8._0_4_ = fVar52 + local_48.x;
          local_d8._4_4_ = fVar52 + fVar50;
          ImDrawList::AddNgonFilled
                    (pIVar36,(ImVec2 *)local_d8,fVar52,IVar30,
                     ShowExampleAppCustomRendering(bool*)::ngon_sides);
          local_48.x = local_48.x + ShowExampleAppCustomRendering(bool*)::sz + 10.0;
          fVar52 = ShowExampleAppCustomRendering(bool*)::sz * 0.5;
          local_d8._0_4_ = fVar52 + local_48.x;
          local_d8._4_4_ = fVar52 + fVar50;
          ImDrawList::AddCircleFilled(pIVar36,(ImVec2 *)local_d8,fVar52,IVar30,local_dc);
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + local_48.x;
          _local_138 = ZEXT416((uint)local_d8._0_4_);
          local_d8._4_4_ = fVar50;
          local_158.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_158.y = fVar50 + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddRectFilled(pIVar36,(ImVec2 *)local_d8,&local_158,IVar30,0.0,0);
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_138._0_4_;
          _local_138 = ZEXT416((uint)local_d8._0_4_);
          local_158.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_158.y = fVar50 + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddRectFilled(pIVar36,(ImVec2 *)local_d8,&local_158,IVar30,10.0,0);
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_138._0_4_;
          _local_138 = ZEXT416((uint)local_d8._0_4_);
          local_158.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_158.y = fVar50 + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddRectFilled(pIVar36,(ImVec2 *)local_d8,&local_158,IVar30,10.0,0x90);
          local_138._0_4_ = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz + 10.0
          ;
          local_158.y = ShowExampleAppCustomRendering(bool*)::sz + fVar50 + -0.5;
          local_138._4_4_ = local_158.y;
          uStack_130._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 0.0 + 0.0;
          uStack_130._4_4_ = ShowExampleAppCustomRendering(bool*)::sz + fStack_164 + 0.0;
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz * 0.5 + (float)local_138._0_4_;
          local_158.x = ShowExampleAppCustomRendering(bool*)::sz + (float)local_138._0_4_;
          local_e8.y = local_158.y;
          local_e8.x = (float)local_138._0_4_;
          ImDrawList::AddTriangleFilled(pIVar36,(ImVec2 *)local_d8,&local_158,&local_e8,IVar30);
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_138._0_4_;
          _local_138 = ZEXT416((uint)local_d8._0_4_);
          local_158.x = (float)local_d8._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_158.y = ShowExampleAppCustomRendering(bool*)::thickness + fVar50;
          ImDrawList::AddRectFilled(pIVar36,(ImVec2 *)local_d8,&local_158,IVar30,0.0,0);
          local_d8._0_4_ = ShowExampleAppCustomRendering(bool*)::sz + 10.0 + (float)local_138._0_4_;
          _local_138 = ZEXT416((uint)local_d8._0_4_);
          local_158.x = ShowExampleAppCustomRendering(bool*)::thickness + (float)local_d8._0_4_;
          local_158.y = ShowExampleAppCustomRendering(bool*)::sz + fVar50;
          ImDrawList::AddRectFilled(pIVar36,(ImVec2 *)local_d8,&local_158,IVar30,0.0,0);
          local_138._0_4_ = (float)local_138._0_4_ + 20.0;
          local_d8._0_4_ = local_138._0_4_;
          local_158.x = (float)local_138._0_4_ + 1.0;
          local_158.y = fVar50 + 1.0;
          ImDrawList::AddRectFilled(pIVar36,(ImVec2 *)local_d8,&local_158,IVar30,0.0,0);
          local_d8._0_4_ = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz;
          local_158.x = (float)local_138._0_4_ + ShowExampleAppCustomRendering(bool*)::sz +
                        ShowExampleAppCustomRendering(bool*)::sz;
          local_158.y = fVar50 + ShowExampleAppCustomRendering(bool*)::sz;
          ImDrawList::AddRectFilledMultiColor
                    (pIVar36,(ImVec2 *)local_d8,&local_158,0xff000000,0xff0000ff,0xff00ffff,
                     0xff00ff00);
          local_d8._0_4_ = (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 10.2;
          local_d8._4_4_ = (ShowExampleAppCustomRendering(bool*)::sz + 10.0) * 3.0;
          Dummy((ImVec2 *)local_d8);
          PopItemWidth();
          EndTabItem();
        }
        p_open = local_50;
        bVar27 = BeginTabItem("Canvas",(bool *)0x0,0);
        if (bVar27) {
          if (ShowExampleAppCustomRendering(bool*)::points == '\0') {
            ShowDemoWindow();
          }
          Checkbox("Enable grid",(bool *)&ShowExampleAppCustomRendering(bool*)::opt_enable_grid);
          Checkbox("Enable context menu",
                   (bool *)&ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu);
          Text(
              "Mouse Left: drag to add lines,\nMouse Right: drag to scroll, click for context menu."
              );
          local_d8 = (undefined1  [8])GetCursorScreenPos();
          IVar55 = GetContentRegionAvail();
          local_158.x = IVar55.x;
          local_158.y = IVar55.y;
          if (local_158.x < 50.0) {
            local_158.x = 50.0;
          }
          if (local_158.y < 50.0) {
            local_158.y = 50.0;
          }
          local_120.x = local_158.x + local_d8._0_4_;
          local_120.y = local_158.y + local_d8._4_4_;
          pIVar34 = GetIO();
          pIVar36 = GetWindowDrawList();
          ImDrawList::AddRectFilled(pIVar36,(ImVec2 *)local_d8,&local_120,0xff323232,0.0,0);
          ImDrawList::AddRect(pIVar36,(ImVec2 *)local_d8,&local_120,0xffffffff,0.0,0,1.0);
          InvisibleButton("canvas",&local_158,3);
          bVar27 = IsItemHovered(0);
          bVar28 = IsItemActive();
          fVar50 = _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0 + local_d8._0_4_;
          fVar52 = _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1 + local_d8._4_4_;
          local_e8.x = (pIVar34->MousePos).x - fVar50;
          local_e8.y = (pIVar34->MousePos).y - fVar52;
          if (((bVar27) && (ShowExampleAppCustomRendering(bool*)::adding_line == '\0')) &&
             (bVar27 = IsMouseClicked(0,false), bVar27)) {
            ImVector<ImVec2>::push_back
                      ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_e8);
            ImVector<ImVec2>::push_back
                      ((ImVector<ImVec2> *)&ShowExampleAppCustomRendering(bool*)::points,&local_e8);
            ShowExampleAppCustomRendering(bool*)::adding_line = '\x01';
          }
          if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') {
            *(ImVec2 *)
             ((long)DAT_001b4370 + (long)ShowExampleAppCustomRendering(bool*)::points * 8 + -8) =
                 local_e8;
            bVar27 = IsMouseDown(0);
            if (!bVar27) {
              ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
            }
          }
          p_open = local_50;
          if (bVar28) {
            if (ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu == '\0') {
              fVar51 = 0.0;
            }
            else {
              fVar51 = -1.0;
            }
            bVar27 = IsMouseDragging(1,fVar51);
            if (bVar27) {
              _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0 =
                   (pIVar34->MouseDelta).x + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0;
              _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1 =
                   (pIVar34->MouseDelta).y + _ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1;
            }
          }
          IVar55 = GetMouseDragDelta(1,-1.0);
          if (((ShowExampleAppCustomRendering(bool*)::opt_enable_context_menu == '\x01') &&
              (IVar55.x == 0.0)) && ((IVar55.y == 0.0 && (!NAN(IVar55.y))))) {
            OpenPopupOnItemClick("context",1);
          }
          bVar27 = BeginPopup("context",0);
          if (bVar27) {
            if (ShowExampleAppCustomRendering(bool*)::adding_line == '\x01') {
              uVar39 = ShowExampleAppCustomRendering(bool*)::points - 2;
              if (DAT_001b436c < (int)uVar39) {
                if (DAT_001b436c == 0) {
                  uVar74 = 8;
                }
                else {
                  uVar74 = DAT_001b436c / 2 + DAT_001b436c;
                }
                if ((int)uVar74 <= (int)uVar39) {
                  uVar74 = uVar39;
                }
                if (DAT_001b436c < (int)uVar74) {
                  pvVar33 = MemAlloc((long)(int)uVar74 << 3);
                  if (DAT_001b4370 != (void *)0x0) {
                    memcpy(pvVar33,DAT_001b4370,
                           (long)ShowExampleAppCustomRendering(bool*)::points << 3);
                    MemFree(DAT_001b4370);
                  }
                  _points = (ulong)uVar74 << 0x20;
                  DAT_001b4370 = pvVar33;
                }
              }
              _points = CONCAT44(DAT_001b436c,uVar39);
            }
            ShowExampleAppCustomRendering(bool*)::adding_line = '\0';
            bVar27 = MenuItem("Remove one",(char *)0x0,false,
                              0 < ShowExampleAppCustomRendering(bool*)::points);
            if (bVar27) {
              uVar39 = ShowExampleAppCustomRendering(bool*)::points - 2;
              if (DAT_001b436c < (int)uVar39) {
                if (DAT_001b436c == 0) {
                  uVar74 = 8;
                }
                else {
                  uVar74 = DAT_001b436c / 2 + DAT_001b436c;
                }
                if ((int)uVar74 <= (int)uVar39) {
                  uVar74 = uVar39;
                }
                if (DAT_001b436c < (int)uVar74) {
                  pvVar33 = MemAlloc((long)(int)uVar74 << 3);
                  if (DAT_001b4370 != (void *)0x0) {
                    memcpy(pvVar33,DAT_001b4370,
                           (long)ShowExampleAppCustomRendering(bool*)::points << 3);
                    MemFree(DAT_001b4370);
                  }
                  _points = (ulong)uVar74 << 0x20;
                  DAT_001b4370 = pvVar33;
                }
              }
              _points = CONCAT44(DAT_001b436c,uVar39);
            }
            bVar27 = MenuItem("Remove all",(char *)0x0,false,
                              0 < ShowExampleAppCustomRendering(bool*)::points);
            if ((bVar27) && (DAT_001b4370 != (void *)0x0)) {
              _points = 0;
              MemFree(DAT_001b4370);
              DAT_001b4370 = (void *)0x0;
            }
            EndPopup();
          }
          ImDrawList::PushClipRect(pIVar36,(ImVec2)local_d8,local_120,true);
          if (ShowExampleAppCustomRendering(bool*)::opt_enable_grid == '\x01') {
            fVar51 = fmodf(_ZZL29ShowExampleAppCustomRenderingPbE9scrolling_0,64.0);
            if (fVar51 < local_158.x) {
              do {
                local_138._0_4_ = fVar51;
                local_100.y = (float)local_d8._4_4_;
                local_100.x = (float)local_d8._0_4_ + fVar51;
                local_f0.y = local_120.y;
                local_f0.x = (float)local_d8._0_4_ + fVar51;
                ImDrawList::AddLine(pIVar36,&local_100,&local_f0,0x28c8c8c8,1.0);
                fVar51 = (float)local_138._0_4_ + 64.0;
              } while (fVar51 < local_158.x);
            }
            fVar51 = fmodf(_ZZL29ShowExampleAppCustomRenderingPbE9scrolling_1,64.0);
            if (fVar51 < local_158.y) {
              do {
                local_138._0_4_ = fVar51;
                local_100.y = (float)local_d8._4_4_ + fVar51;
                local_100.x = local_d8._0_4_;
                local_f0.y = (float)local_d8._4_4_ + fVar51;
                local_f0.x = local_120.x;
                ImDrawList::AddLine(pIVar36,&local_100,&local_f0,0x28c8c8c8,1.0);
                fVar51 = (float)local_138._0_4_ + 64.0;
              } while (fVar51 < local_158.y);
            }
          }
          if (0 < ShowExampleAppCustomRendering(bool*)::points) {
            lVar44 = 0;
            do {
              uVar1 = *(undefined8 *)((long)DAT_001b4370 + lVar44 * 8);
              local_100.x = (float)uVar1 + fVar50;
              local_100.y = (float)((ulong)uVar1 >> 0x20) + fVar52;
              uVar1 = *(undefined8 *)((long)DAT_001b4370 + lVar44 * 8 + 8);
              local_f0.x = (float)uVar1 + fVar50;
              local_f0.y = (float)((ulong)uVar1 >> 0x20) + fVar52;
              ImDrawList::AddLine(pIVar36,&local_100,&local_f0,0xff00ffff,2.0);
              lVar44 = lVar44 + 2;
            } while ((int)lVar44 < ShowExampleAppCustomRendering(bool*)::points);
          }
          ImDrawList::PopClipRect(pIVar36);
          EndTabItem();
        }
        bVar27 = BeginTabItem("BG/FG draw lists",(bool *)0x0,0);
        if (bVar27) {
          Checkbox("Draw in Background draw list",
                   (bool *)&ShowExampleAppCustomRendering(bool*)::draw_bg);
          SameLine(0.0,-1.0);
          HelpMarker("The Background draw list will be rendered below every Dear ImGui windows.");
          Checkbox("Draw in Foreground draw list",
                   (bool *)&ShowExampleAppCustomRendering(bool*)::draw_fg);
          SameLine(0.0,-1.0);
          HelpMarker("The Foreground draw list will be rendered over every Dear ImGui windows.");
          IVar55 = GetWindowPos();
          uStack_130 = extraout_XMM0_Qb_00;
          local_138._0_4_ = IVar55.x;
          local_138._4_4_ = IVar55.y;
          IVar55 = GetWindowSize();
          local_d8._0_4_ = IVar55.x * 0.5 + (float)local_138._0_4_;
          local_d8._4_4_ = IVar55.y * 0.5 + (float)local_138._4_4_;
          if (ShowExampleAppCustomRendering(bool*)::draw_bg == '\x01') {
            pIVar36 = GetBackgroundDrawList();
            ImDrawList::AddCircle(pIVar36,(ImVec2 *)local_d8,IVar55.x * 0.6,0xc80000ff,0,14.0);
          }
          if (ShowExampleAppCustomRendering(bool*)::draw_fg == '\x01') {
            pIVar36 = GetForegroundDrawList();
            ImDrawList::AddCircle(pIVar36,(ImVec2 *)local_d8,IVar55.y * 0.6,0xc800ff00,0,10.0);
          }
          EndTabItem();
        }
        EndTabBar();
      }
    }
    End();
  }
  if (ShowDemoWindow::show_app_metrics == true) {
    ShowMetricsWindow(&ShowDemoWindow::show_app_metrics);
  }
  if (ShowDemoWindow::show_app_stack_tool == true) {
    ShowStackToolWindow(&ShowDemoWindow::show_app_stack_tool);
  }
  if (ShowDemoWindow::show_app_about == true) {
    ShowAboutWindow(&ShowDemoWindow::show_app_about);
  }
  if (ShowDemoWindow::show_app_style_editor == true) {
    Begin("Dear ImGui Style Editor",&ShowDemoWindow::show_app_style_editor,0);
    ShowStyleEditor((ImGuiStyle *)0x0);
    End();
  }
  uVar39 = ShowDemoWindow::no_titlebar + 8;
  if (ShowDemoWindow::no_scrollbar == false) {
    uVar39 = (uint)ShowDemoWindow::no_titlebar;
  }
  uVar74 = uVar39 + 0x400;
  if (ShowDemoWindow::no_menu != false) {
    uVar74 = uVar39;
  }
  uVar39 = uVar74 + 4;
  if (ShowDemoWindow::no_move == false) {
    uVar39 = uVar74;
  }
  uVar74 = uVar39 | 2;
  if (ShowDemoWindow::no_resize == false) {
    uVar74 = uVar39;
  }
  uVar39 = uVar74 | 0x20;
  if (ShowDemoWindow::no_collapse == false) {
    uVar39 = uVar74;
  }
  uVar74 = uVar39 | 0xc0000;
  if (ShowDemoWindow::no_nav == false) {
    uVar74 = uVar39;
  }
  uVar39 = uVar74 | 0x80;
  if (ShowDemoWindow::no_background == false) {
    uVar39 = uVar74;
  }
  uVar74 = uVar39 | 0x2000;
  if (ShowDemoWindow::no_bring_to_front == false) {
    uVar74 = uVar39;
  }
  uVar39 = uVar74 | 0x100000;
  if (ShowDemoWindow::unsaved_document == false) {
    uVar39 = uVar74;
  }
  if (ShowDemoWindow::no_close != false) {
    p_open = (bool *)0x0;
  }
  pIVar35 = GetMainViewport();
  local_d8._0_4_ = (pIVar35->WorkPos).x + 650.0;
  local_d8._4_4_ = (pIVar35->WorkPos).y + 20.0;
  local_158.x = 0.0;
  local_158.y = 0.0;
  SetNextWindowPos((ImVec2 *)local_d8,4,&local_158);
  local_d8._0_4_ = 550.0;
  local_d8._4_4_ = 680.0;
  SetNextWindowSize((ImVec2 *)local_d8,4);
  bVar27 = Begin("Dear ImGui Demo",p_open,uVar39);
  if (bVar27) {
    fVar50 = GetFontSize();
    PushItemWidth(fVar50 * -12.0);
    bVar27 = BeginMenuBar();
    if (bVar27) {
      bVar27 = BeginMenu("Menu",true);
      if (bVar27) {
        if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
          (*GImGuiDemoMarkerCallback)
                    ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                     ,0x174,"Menu/File",GImGuiDemoMarkerCallbackUserData);
        }
        ShowExampleMenuFile();
        EndMenu();
      }
      bVar27 = BeginMenu("Examples",true);
      if (bVar27) {
        if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
          (*GImGuiDemoMarkerCallback)
                    ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                     ,0x17a,"Menu/Examples",GImGuiDemoMarkerCallbackUserData);
        }
        MenuItem("Main menu bar",(char *)0x0,&ShowDemoWindow::show_app_main_menu_bar,true);
        MenuItem("Console",(char *)0x0,&ShowDemoWindow::show_app_console,true);
        MenuItem("Log",(char *)0x0,&ShowDemoWindow::show_app_log,true);
        MenuItem("Simple layout",(char *)0x0,&ShowDemoWindow::show_app_layout,true);
        MenuItem("Property editor",(char *)0x0,&ShowDemoWindow::show_app_property_editor,true);
        MenuItem("Long text display",(char *)0x0,&ShowDemoWindow::show_app_long_text,true);
        MenuItem("Auto-resizing window",(char *)0x0,&ShowDemoWindow::show_app_auto_resize,true);
        MenuItem("Constrained-resizing window",(char *)0x0,
                 &ShowDemoWindow::show_app_constrained_resize,true);
        MenuItem("Simple overlay",(char *)0x0,&ShowDemoWindow::show_app_simple_overlay,true);
        MenuItem("Fullscreen window",(char *)0x0,&ShowDemoWindow::show_app_fullscreen,true);
        MenuItem("Manipulating window titles",(char *)0x0,&ShowDemoWindow::show_app_window_titles,
                 true);
        MenuItem("Custom rendering",(char *)0x0,&ShowDemoWindow::show_app_custom_rendering,true);
        MenuItem("Documents",(char *)0x0,&ShowDemoWindow::show_app_documents,true);
        EndMenu();
      }
      bVar27 = BeginMenu("Tools",true);
      if (bVar27) {
        if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
          (*GImGuiDemoMarkerCallback)
                    ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                     ,0x18d,"Menu/Tools",GImGuiDemoMarkerCallbackUserData);
        }
        MenuItem("Metrics/Debugger",(char *)0x0,&ShowDemoWindow::show_app_metrics,true);
        MenuItem("Stack Tool",(char *)0x0,&ShowDemoWindow::show_app_stack_tool,true);
        MenuItem("Style Editor",(char *)0x0,&ShowDemoWindow::show_app_style_editor,true);
        MenuItem("About Dear ImGui",(char *)0x0,&ShowDemoWindow::show_app_about,true);
        EndMenu();
      }
      EndMenuBar();
    }
    Text("dear imgui says hello. (%s)");
    Spacing();
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x19c,"Help",GImGuiDemoMarkerCallbackUserData);
    }
    bVar27 = CollapsingHeader("Help",0);
    if (bVar27) {
      Text("ABOUT THIS DEMO:");
      BulletText("Sections below are demonstrating many aspects of the library.");
      BulletText("The \"Examples\" menu above leads to more demo contents.");
      BulletText(
                "The \"Tools\" menu above gives access to: About Box, Style Editor,\nand Metrics/Debugger (general purpose Dear ImGui debugging tool)."
                );
      Separator();
      Text("PROGRAMMER GUIDE:");
      BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
      BulletText("See comments in imgui.cpp.");
      BulletText("See example applications in the examples/ folder.");
      BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
      BulletText("Set \'io.ConfigFlags |= NavEnableKeyboard\' for keyboard controls.");
      BulletText("Set \'io.ConfigFlags |= NavEnableGamepad\' for gamepad controls.");
      Separator();
      Text("USER GUIDE:");
      ShowUserGuide();
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x1b3,"Configuration",GImGuiDemoMarkerCallbackUserData);
    }
    bVar27 = CollapsingHeader("Configuration",0);
    if (bVar27) {
      pIVar34 = GetIO();
      bVar27 = TreeNode("Configuration##2");
      if (bVar27) {
        CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",&pIVar34->ConfigFlags,1);
        SameLine(0.0,-1.0);
        HelpMarker("Enable keyboard controls.");
        CheckboxFlags("io.ConfigFlags: NavEnableGamepad",&pIVar34->ConfigFlags,2);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details."
                  );
        CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos",&pIVar34->ConfigFlags,4);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos."
                  );
        CheckboxFlags("io.ConfigFlags: NoMouse",&pIVar34->ConfigFlags,0x10);
        if ((pIVar34->ConfigFlags & 0x10) != 0) {
          dVar54 = GetTime();
          fVar50 = fmodf((float)dVar54,0.4);
          if (fVar50 < 0.2) {
            SameLine(0.0,-1.0);
            Text("<<PRESS SPACE TO DISABLE>>");
          }
          bVar27 = IsKeyPressed(0x20c,true);
          if (bVar27) {
            *(byte *)&pIVar34->ConfigFlags = (byte)pIVar34->ConfigFlags & 0xef;
          }
        }
        CheckboxFlags("io.ConfigFlags: NoMouseCursorChange",&pIVar34->ConfigFlags,0x20);
        SameLine(0.0,-1.0);
        HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");
        Checkbox("io.ConfigInputTrickleEventQueue",&pIVar34->ConfigInputTrickleEventQueue);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable input queue trickling: some types of events submitted during the same frame (e.g. button down + up) will be spread over multiple frames, improving interactions with low framerates."
                  );
        Checkbox("io.ConfigInputTextCursorBlink",&pIVar34->ConfigInputTextCursorBlink);
        SameLine(0.0,-1.0);
        HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting).")
        ;
        Checkbox("io.ConfigDragClickToInputText",&pIVar34->ConfigDragClickToInputText);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving)."
                  );
        Checkbox("io.ConfigWindowsResizeFromEdges",&pIVar34->ConfigWindowsResizeFromEdges);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback."
                  );
        Checkbox("io.ConfigWindowsMoveFromTitleBarOnly",&pIVar34->ConfigWindowsMoveFromTitleBarOnly)
        ;
        Checkbox("io.MouseDrawCursor",&pIVar34->MouseDrawCursor);
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something)."
                  );
        Text("Also see Style->Rendering for rendering options.");
        TreePop();
        Separator();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1de,"Configuration/Backend Flags",GImGuiDemoMarkerCallbackUserData);
      }
      bVar27 = TreeNode("Backend Flags");
      if (bVar27) {
        HelpMarker(
                  "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\nHere we expose them as read-only fields to avoid breaking interactions with your backend."
                  );
        local_d8._0_4_ = pIVar34->BackendFlags;
        CheckboxFlags("io.BackendFlags: HasGamepad",(int *)local_d8,1);
        CheckboxFlags("io.BackendFlags: HasMouseCursors",(int *)local_d8,2);
        CheckboxFlags("io.BackendFlags: HasSetMousePos",(int *)local_d8,4);
        CheckboxFlags("io.BackendFlags: RendererHasVtxOffset",(int *)local_d8,8);
        TreePop();
        Separator();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1f0,"Configuration/Style",GImGuiDemoMarkerCallbackUserData);
      }
      bVar27 = TreeNode("Style");
      if (bVar27) {
        HelpMarker(
                  "The same contents can be accessed in \'Tools->Style Editor\' or by calling the ShowStyleEditor() function."
                  );
        ShowStyleEditor((ImGuiStyle *)0x0);
        TreePop();
        Separator();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1f9,"Configuration/Capture, Logging",GImGuiDemoMarkerCallbackUserData);
      }
      bVar27 = TreeNode("Capture/Logging");
      if (bVar27) {
        HelpMarker(
                  "The logging API redirects all text output so you can easily capture the content of a window or a block. Tree nodes can be automatically expanded.\nTry opening any of the contents below in this window and then click one of the \"Log To\" button."
                  );
        LogButtons();
        HelpMarker(
                  "You can also call ImGui::LogText() to output directly to the log without a visual output."
                  );
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar27 = Button("Copy \"Hello, world!\" to clipboard",(ImVec2 *)local_d8);
        if (bVar27) {
          LogToClipboard(-1);
          LogText("Hello, world!");
          LogFinish();
        }
        TreePop();
      }
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x20d,"Window options",GImGuiDemoMarkerCallbackUserData);
    }
    bVar27 = CollapsingHeader("Window options",0);
    if (bVar27) {
      local_d8._0_4_ = 0.0;
      local_d8._4_4_ = 0.0;
      bVar27 = BeginTable("split",3,0,(ImVec2 *)local_d8,0.0);
      if (bVar27) {
        TableNextColumn();
        Checkbox("No titlebar",&ShowDemoWindow::no_titlebar);
        TableNextColumn();
        Checkbox("No scrollbar",&ShowDemoWindow::no_scrollbar);
        TableNextColumn();
        Checkbox("No menu",&ShowDemoWindow::no_menu);
        TableNextColumn();
        Checkbox("No move",&ShowDemoWindow::no_move);
        TableNextColumn();
        Checkbox("No resize",&ShowDemoWindow::no_resize);
        TableNextColumn();
        Checkbox("No collapse",&ShowDemoWindow::no_collapse);
        TableNextColumn();
        Checkbox("No close",&ShowDemoWindow::no_close);
        TableNextColumn();
        Checkbox("No nav",&ShowDemoWindow::no_nav);
        TableNextColumn();
        Checkbox("No background",&ShowDemoWindow::no_background);
        TableNextColumn();
        Checkbox("No bring to front",&ShowDemoWindow::no_bring_to_front);
        TableNextColumn();
        Checkbox("Unsaved document",&ShowDemoWindow::unsaved_document);
        EndTable();
      }
    }
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0xcb8,"Popups",GImGuiDemoMarkerCallbackUserData);
    }
    bVar27 = CollapsingHeader("Popups & Modal windows",0);
    if (bVar27) {
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0xcce,"Popups/Popups",GImGuiDemoMarkerCallbackUserData);
      }
      bVar27 = TreeNode("Popups");
      if (bVar27) {
        TextWrapped(
                   "When a popup is active, it inhibits interacting with windows that are behind the popup. Clicking outside the popup closes it."
                   );
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar27 = Button("Select..",(ImVec2 *)local_d8);
        if (bVar27) {
          OpenPopup("my_select_popup",0);
        }
        SameLine(0.0,-1.0);
        if ((long)ShowDemoWindowPopups()::selected_fish == -1) {
          pcVar45 = "<None>";
        }
        else {
          pcVar45 = (&PTR_anon_var_dwarf_66bc3_001a8540)[ShowDemoWindowPopups()::selected_fish];
        }
        TextUnformatted(pcVar45,(char *)0x0);
        bVar27 = BeginPopup("my_select_popup",0);
        if (bVar27) {
          lVar44 = 0;
          Text("Aquarium");
          Separator();
          ppuVar49 = &PTR_anon_var_dwarf_66bc3_001a8540;
          do {
            local_d8._0_4_ = 0.0;
            local_d8._4_4_ = 0.0;
            bVar27 = Selectable(*ppuVar49,false,0,(ImVec2 *)local_d8);
            if (bVar27) {
              ShowDemoWindowPopups()::selected_fish = (int)lVar44;
            }
            lVar44 = lVar44 + 1;
            ppuVar49 = ppuVar49 + 1;
          } while (lVar44 != 5);
          EndPopup();
        }
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar27 = Button("Toggle..",(ImVec2 *)local_d8);
        if (bVar27) {
          OpenPopup("my_toggle_popup",0);
        }
        bVar27 = BeginPopup("my_toggle_popup",0);
        if (bVar27) {
          pbVar43 = (bool *)&ShowDemoWindowPopups()::toggles;
          lVar44 = 0;
          do {
            MenuItem(*(char **)((long)&PTR_anon_var_dwarf_66bc3_001a8540 + lVar44),"",pbVar43,true);
            lVar44 = lVar44 + 8;
            pbVar43 = pbVar43 + 1;
          } while (lVar44 != 0x28);
          bVar27 = BeginMenu("Sub-menu",true);
          if (bVar27) {
            MenuItem("Click me",(char *)0x0,false,true);
            EndMenu();
          }
          Separator();
          Text("Tooltip here");
          bVar27 = IsItemHovered(0);
          if (bVar27) {
            SetTooltip("I am a tooltip over a popup");
          }
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          bVar27 = Button("Stacked Popup",(ImVec2 *)local_d8);
          if (bVar27) {
            OpenPopup("another popup",0);
          }
          bVar27 = BeginPopup("another popup",0);
          if (bVar27) {
            pbVar43 = (bool *)&ShowDemoWindowPopups()::toggles;
            lVar44 = 0;
            do {
              MenuItem(*(char **)((long)&PTR_anon_var_dwarf_66bc3_001a8540 + lVar44),"",pbVar43,true
                      );
              lVar44 = lVar44 + 8;
              pbVar43 = pbVar43 + 1;
            } while (lVar44 != 0x28);
            bVar27 = BeginMenu("Sub-menu",true);
            if (bVar27) {
              MenuItem("Click me",(char *)0x0,false,true);
              local_d8._0_4_ = 0.0;
              local_d8._4_4_ = 0.0;
              bVar27 = Button("Stacked Popup",(ImVec2 *)local_d8);
              if (bVar27) {
                OpenPopup("another popup",0);
              }
              bVar27 = BeginPopup("another popup",0);
              if (bVar27) {
                Text("I am the last one here.");
                EndPopup();
              }
              EndMenu();
            }
            EndPopup();
          }
          EndPopup();
        }
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar27 = Button("With a menu..",(ImVec2 *)local_d8);
        if (bVar27) {
          OpenPopup("my_file_popup",0);
        }
        bVar27 = BeginPopup("my_file_popup",0x400);
        if (bVar27) {
          bVar27 = BeginMenuBar();
          if (bVar27) {
            bVar27 = BeginMenu("File",true);
            if (bVar27) {
              ShowExampleMenuFile();
              EndMenu();
            }
            bVar27 = BeginMenu("Edit",true);
            if (bVar27) {
              MenuItem("Dummy",(char *)0x0,false,true);
              EndMenu();
            }
            EndMenuBar();
          }
          Text("Hello from popup!");
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          Button("This is a dummy button..",(ImVec2 *)local_d8);
          EndPopup();
        }
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0xd2d,"Popups/Context menus",GImGuiDemoMarkerCallbackUserData);
      }
      bVar27 = TreeNode("Context menus");
      if (bVar27) {
        HelpMarker(
                  "\"Context\" functions are simple helpers to associate a Popup to a given Item or Window identifier."
                  );
        lVar44 = 0;
        do {
          pcVar45 = *(char **)((long)&PTR_anon_var_dwarf_66d13_001a8570 + lVar44);
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          Selectable(pcVar45,false,0,(ImVec2 *)local_d8);
          bVar27 = BeginPopupContextItem((char *)0x0,1);
          if (bVar27) {
            Text("This a popup for \"%s\"!",pcVar45);
            local_d8._0_4_ = 0.0;
            local_d8._4_4_ = 0.0;
            bVar27 = Button("Close",(ImVec2 *)local_d8);
            if (bVar27) {
              CloseCurrentPopup();
            }
            EndPopup();
          }
          bVar27 = IsItemHovered(0);
          if (bVar27) {
            SetTooltip("Right-click to open popup");
          }
          lVar44 = lVar44 + 8;
        } while (lVar44 != 0x28);
        HelpMarker("Text() elements don\'t have stable identifiers so we need to provide one.");
        Text("Value = %.3f <-- (1) right-click this value",(double)ShowDemoWindowPopups()::value);
        bVar27 = BeginPopupContextItem("my popup",1);
        if (bVar27) {
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          bVar27 = Selectable("Set to zero",false,0,(ImVec2 *)local_d8);
          if (bVar27) {
            ShowDemoWindowPopups()::value = 0.0;
          }
          local_d8._0_4_ = 0.0;
          local_d8._4_4_ = 0.0;
          bVar27 = Selectable("Set to PI",false,0,(ImVec2 *)local_d8);
          if (bVar27) {
            ShowDemoWindowPopups()::value = 3.1415;
          }
          SetNextItemWidth(-1.1754944e-38);
          DragFloat("##Value",&ShowDemoWindowPopups()::value,0.1,0.0,0.0,"%.3f",0);
          EndPopup();
        }
        Text("(2) Or right-click this text");
        OpenPopupOnItemClick("my popup",1);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar27 = Button("(3) Or click this button",(ImVec2 *)local_d8);
        if (bVar27) {
          OpenPopup("my popup",0);
        }
        HelpMarker(
                  "Showcase using a popup ID linked to item ID, with the item having a changing label + stable ID using the ### operator."
                  );
        sprintf(local_d8,"Button: %s###Button",ShowDemoWindowPopups()::name);
        local_158.x = 0.0;
        local_158.y = 0.0;
        Button(local_d8,&local_158);
        bVar27 = BeginPopupContextItem((char *)0x0,1);
        if (bVar27) {
          Text("Edit name:");
          InputText("##edit",ShowDemoWindowPopups()::name,0x20,0,(ImGuiInputTextCallback)0x0,
                    (void *)0x0);
          local_158.x = 0.0;
          local_158.y = 0.0;
          bVar27 = Button("Close",&local_158);
          if (bVar27) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        SameLine(0.0,-1.0);
        Text("(<-- right-click here)");
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0xd82,"Popups/Modals",GImGuiDemoMarkerCallbackUserData);
      }
      bVar27 = TreeNode("Modals");
      if (bVar27) {
        TextWrapped(
                   "Modal windows are like popups but the user cannot close them by clicking outside."
                   );
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar27 = Button("Delete..",(ImVec2 *)local_d8);
        if (bVar27) {
          OpenPopup("Delete?",0);
        }
        pIVar35 = GetMainViewport();
        local_158.x = (float)DAT_0017b320;
        local_158.y = DAT_0017b320._4_4_;
        local_d8._0_4_ = (pIVar35->Size).x * local_158.x + (pIVar35->Pos).x;
        local_d8._4_4_ = (pIVar35->Size).y * local_158.y + (pIVar35->Pos).y;
        SetNextWindowPos((ImVec2 *)local_d8,8,&local_158);
        bVar27 = BeginPopupModal("Delete?",(bool *)0x0,0x40);
        if (bVar27) {
          Text("All those beautiful files will be deleted.\nThis operation cannot be undone!\n\n");
          Separator();
          local_158.x = 0.0;
          local_158.y = 0.0;
          PushStyleVar(0xb,&local_158);
          Checkbox("Don\'t ask me next time",(bool *)&ShowDemoWindowPopups()::dont_ask_me_next_time)
          ;
          PopStyleVar(1);
          local_158.x = 120.0;
          local_158.y = 0.0;
          bVar27 = Button("OK",&local_158);
          if (bVar27) {
            CloseCurrentPopup();
          }
          SetItemDefaultFocus();
          SameLine(0.0,-1.0);
          local_158.x = 120.0;
          local_158.y = 0.0;
          bVar27 = Button("Cancel",&local_158);
          if (bVar27) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        local_158.x = 0.0;
        local_158.y = 0.0;
        bVar27 = Button("Stacked modals..",&local_158);
        if (bVar27) {
          OpenPopup("Stacked 1",0);
        }
        bVar27 = BeginPopupModal("Stacked 1",(bool *)0x0,0x400);
        if (bVar27) {
          bVar27 = BeginMenuBar();
          if (bVar27) {
            bVar27 = BeginMenu("File",true);
            if (bVar27) {
              MenuItem("Some menu item",(char *)0x0,false,true);
              EndMenu();
            }
            EndMenuBar();
          }
          Text(
              "Hello from Stacked The First\nUsing style.Colors[ImGuiCol_ModalWindowDimBg] behind it."
              );
          Combo("Combo",&ShowDemoWindowPopups()::item,"aaaa",-1);
          ColorEdit4("color",(float *)ShowDemoWindowPopups()::color,0);
          local_158.x = 0.0;
          local_158.y = 0.0;
          bVar27 = Button("Add another modal..",&local_158);
          if (bVar27) {
            OpenPopup("Stacked 2",0);
          }
          local_120.x._0_1_ = 1;
          bVar27 = BeginPopupModal("Stacked 2",(bool *)&local_120,0);
          if (bVar27) {
            Text("Hello from Stacked The Second!");
            local_158.x = 0.0;
            local_158.y = 0.0;
            bVar27 = Button("Close",&local_158);
            if (bVar27) {
              CloseCurrentPopup();
            }
            EndPopup();
          }
          local_158.x = 0.0;
          local_158.y = 0.0;
          bVar27 = Button("Close",&local_158);
          if (bVar27) {
            CloseCurrentPopup();
          }
          EndPopup();
        }
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0xdce,"Popups/Menus inside a regular window",GImGuiDemoMarkerCallbackUserData);
      }
      bVar27 = TreeNode("Menus inside a regular window");
      if (bVar27) {
        TextWrapped(
                   "Below we are testing adding menu items to a regular window. It\'s rather unusual but should work!"
                   );
        Separator();
        PushID("foo");
        MenuItem("Menu item","CTRL+M",false,true);
        bVar27 = BeginMenu("Menu inside a regular window",true);
        if (bVar27) {
          ShowExampleMenuFile();
          EndMenu();
        }
        PopID();
        Separator();
        TreePop();
      }
    }
    ShowDemoWindowTables();
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x160d,"Filtering",GImGuiDemoMarkerCallbackUserData);
    }
    bVar27 = CollapsingHeader("Filtering",0);
    if (bVar27) {
      if ((ShowDemoWindowMisc()::filter == '\0') &&
         (iVar42 = __cxa_guard_acquire(&ShowDemoWindowMisc()::filter), iVar42 != 0)) {
        ImGuiTextFilter::ImGuiTextFilter((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"");
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,ShowDemoWindowMisc()::filter,&__dso_handle);
        __cxa_guard_release(&ShowDemoWindowMisc()::filter);
      }
      Text(
          "Filter usage:\n  \"\"         display all lines\n  \"xxx\"      display lines containing \"xxx\"\n  \"xxx,yyy\"  display lines containing \"xxx\" or \"yyy\"\n  \"-xxx\"     hide lines containing \"xxx\""
          );
      ImGuiTextFilter::Draw((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,"Filter (inc,-exc)",0.0)
      ;
      lVar44 = 0;
      do {
        bVar27 = ImGuiTextFilter::PassFilter
                           ((ImGuiTextFilter *)ShowDemoWindowMisc()::filter,
                            *(char **)((long)&PTR_anon_var_dwarf_6d4c7_001a8810 + lVar44),
                            (char *)0x0);
        if (bVar27) {
          BulletText("%s");
        }
        lVar44 = lVar44 + 8;
      } while (lVar44 != 0x40);
    }
    if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
      (*GImGuiDemoMarkerCallback)
                ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                 ,0x161f,"Inputs, Navigation & Focus",GImGuiDemoMarkerCallbackUserData);
    }
    bVar27 = CollapsingHeader("Inputs, Navigation & Focus",0);
    if (bVar27) {
      IVar55 = (ImVec2)GetIO();
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1625,"Inputs, Navigation & Focus/Output",GImGuiDemoMarkerCallbackUserData);
      }
      SetNextItemOpen(true,2);
      bVar27 = TreeNode("Output");
      if (bVar27) {
        Text("io.WantCaptureMouse: %d",(ulong)*(bool *)((long)IVar55 + 200));
        Text("io.WantCaptureMouseUnlessPopupClose: %d",(ulong)*(bool *)((long)IVar55 + 0x364c));
        Text("io.WantCaptureKeyboard: %d",(ulong)*(bool *)((long)IVar55 + 0xc9));
        Text("io.WantTextInput: %d",(ulong)*(bool *)((long)IVar55 + 0xca));
        Text("io.WantSetMousePos: %d",(ulong)*(bool *)((long)IVar55 + 0xcb));
        Text("io.NavActive: %d, io.NavVisible: %d",(ulong)*(bool *)((long)IVar55 + 0xcd),
             (ulong)*(bool *)((long)IVar55 + 0xce));
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1633,"Inputs, Navigation & Focus/Mouse State",GImGuiDemoMarkerCallbackUserData
                  );
      }
      bVar27 = TreeNode("Mouse State");
      if (bVar27) {
        bVar27 = IsMousePosValid((ImVec2 *)0x0);
        if (bVar27) {
          Text("Mouse pos: (%g, %g)",(double)((ImVec2 *)((long)IVar55 + 0xd8c))->x,
               (double)*(float *)((long)IVar55 + 0xd90));
        }
        else {
          Text("Mouse pos: <INVALID>");
        }
        Text("Mouse delta: (%g, %g)",(double)((ImVec2 *)((long)IVar55 + 0xe8))->x);
        lVar44 = 0;
        Text("Mouse down:");
        do {
          bVar27 = IsMouseDown((ImGuiMouseButton)lVar44);
          if (bVar27) {
            SameLine(0.0,-1.0);
            Text("b%d (%.02f secs)",(double)((float *)((long)IVar55 + 0x36d8))[lVar44]);
          }
          lVar44 = lVar44 + 1;
        } while (lVar44 != 5);
        Text("Mouse clicked:");
        uVar39 = 0;
        do {
          bVar27 = IsMouseClicked(uVar39,false);
          if (bVar27) {
            SameLine(0.0,-1.0);
            uVar74 = GetMouseClickedCount(uVar39);
            Text("b%d (%d)",(ulong)uVar39,(ulong)uVar74);
          }
          uVar39 = uVar39 + 1;
        } while (uVar39 != 5);
        Text("Mouse released:");
        uVar72 = 0;
        do {
          bVar27 = IsMouseReleased((int)uVar72);
          if (bVar27) {
            SameLine(0.0,-1.0);
            Text("b%d",uVar72);
          }
          uVar39 = (int)uVar72 + 1;
          uVar72 = (ulong)uVar39;
        } while (uVar39 != 5);
        Text("Mouse wheel: %.1f",(double)*(float *)((long)IVar55 + 0xd9c));
        Text("Pen Pressure: %.1f",(double)*(float *)((long)IVar55 + 0x37b4));
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1646,"Inputs, Navigation & Focus/Keyboard, Gamepad & Navigation State",
                   GImGuiDemoMarkerCallbackUserData);
      }
      bVar27 = TreeNode("Keyboard, Gamepad & Navigation State");
      if (bVar27) {
        uVar72 = 0;
        Text("Keys down:");
        do {
          if ((0x1ff < uVar72) || (pIVar34 = GetIO(), pIVar34->KeyMap[uVar72] == -1)) {
            key = (ImGuiKey)uVar72;
            bVar27 = IsKeyDown(key);
            if (bVar27) {
              SameLine(0.0,-1.0);
              pcVar45 = GetKeyName(key);
              pIVar38 = GetKeyData(key);
              Text("\"%s\" %d (%.02f secs)",(double)pIVar38->DownDuration,pcVar45,
                   uVar72 & 0xffffffff);
            }
          }
          uVar72 = uVar72 + 1;
        } while (uVar72 != 0x285);
        Text("Keys pressed:");
        uVar72 = 0;
        do {
          if ((0x1ff < uVar72) || (pIVar34 = GetIO(), pIVar34->KeyMap[uVar72] == -1)) {
            bVar27 = IsKeyPressed((ImGuiKey)uVar72,true);
            if (bVar27) {
              SameLine(0.0,-1.0);
              pcVar45 = GetKeyName((ImGuiKey)uVar72);
              Text("\"%s\" %d",pcVar45,uVar72 & 0xffffffff);
            }
          }
          uVar72 = uVar72 + 1;
        } while (uVar72 != 0x285);
        Text("Keys released:");
        uVar72 = 0;
        do {
          if ((0x1ff < uVar72) || (pIVar34 = GetIO(), pIVar34->KeyMap[uVar72] == -1)) {
            bVar27 = IsKeyReleased((ImGuiKey)uVar72);
            if (bVar27) {
              SameLine(0.0,-1.0);
              pcVar45 = GetKeyName((ImGuiKey)uVar72);
              Text("\"%s\" %d",pcVar45,uVar72 & 0xffffffff);
            }
          }
          uVar72 = uVar72 + 1;
        } while (uVar72 != 0x285);
        pcVar45 = "CTRL ";
        if (*(bool *)((long)IVar55 + 0xda4) == false) {
          pcVar45 = "";
        }
        pcVar46 = "SHIFT ";
        if (*(bool *)((long)IVar55 + 0xda5) == false) {
          pcVar46 = "";
        }
        pcVar41 = "ALT ";
        if (*(bool *)((long)IVar55 + 0xda6) == false) {
          pcVar41 = "";
        }
        Text("Keys mods: %s%s%s%s",pcVar45,pcVar46,pcVar41);
        Text("Chars queue:");
        if (0 < ((ImVector<unsigned_short> *)((long)IVar55 + 0x37c0))->Size) {
          lVar44 = 0;
          do {
            uVar3 = (*(unsigned_short **)((long)IVar55 + 0x37c8))[lVar44];
            SameLine(0.0,-1.0);
            uVar39 = (int)(char)uVar3;
            if (0xde < (ushort)(uVar3 - 0x21)) {
              uVar39 = 0x3f;
            }
            Text("\'%c\' (0x%04X)",(ulong)uVar39,(ulong)uVar3);
            lVar44 = lVar44 + 1;
          } while (lVar44 < ((ImVector<unsigned_short> *)((long)IVar55 + 0x37c0))->Size);
        }
        uVar72 = 0;
        Text("NavInputs down:");
        do {
          if (0.0 < ((float *)((long)IVar55 + 0xda8))[uVar72]) {
            SameLine(0.0,-1.0);
            Text("[%d] %.2f (%.02f secs)",(double)((float *)((long)IVar55 + 0xda8))[uVar72],
                 uVar72 & 0xffffffff);
          }
          uVar72 = uVar72 + 1;
        } while (uVar72 != 0x14);
        Text("NavInputs pressed:");
        uVar72 = 0;
        do {
          if ((((float *)((long)IVar55 + 0x3714))[uVar72] == 0.0) &&
             (!NAN(((float *)((long)IVar55 + 0x3714))[uVar72]))) {
            SameLine(0.0,-1.0);
            Text("[%d]",uVar72 & 0xffffffff);
          }
          uVar72 = uVar72 + 1;
        } while (uVar72 != 0x14);
        local_48 = IVar55;
        IVar55 = GetCursorScreenPos();
        fVar50 = IVar55.x;
        fVar52 = IVar55.y;
        local_118._4_4_ = fVar52 + 102.0 + 10.0;
        local_118._0_4_ = fVar50 + 102.0 + 18.0 + 10.0;
        uStack_110._0_4_ = (float)extraout_XMM0_Qb_01 + 0.0 + 0.0;
        uStack_110._4_4_ = (float)((ulong)extraout_XMM0_Qb_01 >> 0x20) + 0.0 + 0.0;
        local_138._0_4_ = fVar50 + 5.0 + -34.0;
        pIVar36 = GetWindowDrawList();
        ImDrawList::PushClipRect(pIVar36,IVar55,(ImVec2)local_118,true);
        lVar44 = 0x10;
        do {
          local_d8._0_4_ =
               (float)*(int *)((long)&PTR_anon_var_dwarf_6d50f_001a8840 + lVar44) * 9.0 +
               (float)*(int *)((long)&PTR_anon_var_dwarf_6d50f_001a8840 + lVar44 + 4) * 34.0 +
               (float)local_138._0_4_;
          local_d8._4_4_ =
               (float)*(int *)((long)&PTR_anon_var_dwarf_6d50f_001a8840 + lVar44) * 34.0 + fVar52;
          local_158.x = (float)local_d8._0_4_ + 35.0;
          local_158.y = (float)local_d8._4_4_ + 35.0;
          ImDrawList::AddRectFilled(pIVar36,(ImVec2 *)local_d8,&local_158,0xffcccccc,3.0,0);
          ImDrawList::AddRect(pIVar36,(ImVec2 *)local_d8,&local_158,0xff181818,3.0,0,1.0);
          local_120.x = (float)local_d8._0_4_ + 5.0;
          local_120.y = (float)local_d8._4_4_ + 3.0;
          local_e8.x = local_120.x + 25.0;
          local_e8.y = local_120.y + 25.0;
          ImDrawList::AddRect(pIVar36,&local_120,&local_e8,0xffc1c1c1,2.0,0,2.0);
          ImDrawList::AddRectFilled(pIVar36,&local_120,&local_e8,0xfffcfcfc,2.0,0);
          local_100.x = (float)local_d8._0_4_ + 7.0;
          local_100.y = (float)local_d8._4_4_ + 4.0;
          ImDrawList::AddText(pIVar36,&local_100,0xff404040,
                              *(char **)((long)&PTR_anon_var_dwarf_6d51b_001a8848 + lVar44),
                              (char *)0x0);
          bVar27 = IsKeyDown(*(ImGuiKey *)((long)&DAT_001a8850 + lVar44));
          if (bVar27) {
            ImDrawList::AddRectFilled(pIVar36,(ImVec2 *)local_d8,&local_158,0x800000ff,3.0,0);
          }
          lVar44 = lVar44 + 0x18;
        } while (lVar44 != 0x178);
        ImDrawList::PopClipRect(pIVar36);
        local_d8._0_4_ = (float)local_118._0_4_ - fVar50;
        local_d8._4_4_ = (float)local_118._4_4_ - fVar52;
        Dummy((ImVec2 *)local_d8);
        TreePop();
        IVar55 = local_48;
      }
      bVar27 = TreeNode("Capture override");
      if (bVar27) {
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        Button("Hovering me sets the\nkeyboard capture flag",(ImVec2 *)local_d8);
        bVar27 = IsItemHovered(0);
        if (bVar27) {
          CaptureKeyboardFromApp(true);
        }
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        Button("Holding me clears the\nthe keyboard capture flag",(ImVec2 *)local_d8);
        bVar27 = IsItemActive();
        if (bVar27) {
          CaptureKeyboardFromApp(false);
        }
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x1696,"Inputs, Navigation & Focus/Tabbing",GImGuiDemoMarkerCallbackUserData);
      }
      bVar27 = TreeNode("Tabbing");
      if (bVar27) {
        Text("Use TAB/SHIFT+TAB to cycle through keyboard editable fields.");
        InputText("1",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("2",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        InputText("3",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        PushAllowKeyboardFocus(false);
        InputText("4 (tab skip)",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        SameLine(0.0,-1.0);
        HelpMarker("Item won\'t be cycled through when using TAB or Shift+Tab.");
        PopAllowKeyboardFocus();
        InputText("5",ShowDemoWindowMisc()::buf,0x20,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x16a6,"Inputs, Navigation & Focus/Focus from code",
                   GImGuiDemoMarkerCallbackUserData);
      }
      bVar27 = TreeNode("Focus from code");
      if (bVar27) {
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar27 = Button("Focus on 1",(ImVec2 *)local_d8);
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar28 = Button("Focus on 2",(ImVec2 *)local_d8);
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar29 = Button("Focus on 3",(ImVec2 *)local_d8);
        if (bVar27) {
          SetKeyboardFocusHere(0);
        }
        InputText("1",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        bVar27 = IsItemActive();
        uVar39 = (uint)bVar27;
        if (bVar28) {
          SetKeyboardFocusHere(0);
        }
        InputText("2",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,(void *)0x0);
        bVar27 = IsItemActive();
        if (bVar27) {
          uVar39 = 2;
        }
        PushAllowKeyboardFocus(false);
        if (bVar29) {
          SetKeyboardFocusHere(0);
        }
        InputText("3 (tab skip)",ShowDemoWindowMisc()::buf,0x80,0,(ImGuiInputTextCallback)0x0,
                  (void *)0x0);
        bVar27 = IsItemActive();
        if (bVar27) {
          uVar39 = 3;
        }
        SameLine(0.0,-1.0);
        HelpMarker("Item won\'t be cycled through when using TAB or Shift+Tab.");
        PopAllowKeyboardFocus();
        if (uVar39 == 0) {
          Text("Item with focus: <none>");
        }
        else {
          Text("Item with focus: %d",(ulong)uVar39);
        }
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar27 = Button("Focus on X",(ImVec2 *)local_d8);
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar28 = Button("Focus on Y",(ImVec2 *)local_d8);
        iVar42 = 1;
        if (!bVar28) {
          iVar42 = bVar27 - 1;
        }
        SameLine(0.0,-1.0);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        bVar27 = Button("Focus on Z",(ImVec2 *)local_d8);
        iVar68 = 2;
        if (!bVar27) {
          iVar68 = iVar42;
        }
        if (iVar68 != -1) {
          SetKeyboardFocusHere(iVar68);
        }
        SliderFloat3("Float3",(float *)ShowDemoWindowMisc()::f3,0.0,1.0,"%.3f",0);
        TextWrapped("NB: Cursor & selection are preserved when refocusing last used item in code.");
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x16d0,"Inputs, Navigation & Focus/Dragging",GImGuiDemoMarkerCallbackUserData);
      }
      bVar27 = TreeNode("Dragging");
      if (bVar27) {
        TextWrapped(
                   "You can use ImGui::GetMouseDragDelta(0) to query for the dragged amount on any widget."
                   );
        uVar39 = 0;
        do {
          Text("IsMouseDragging(%d):",(ulong)uVar39);
          bVar27 = IsMouseDragging(uVar39,-1.0);
          Text("  w/ default threshold: %d,",(ulong)bVar27);
          bVar27 = IsMouseDragging(uVar39,0.0);
          Text("  w/ zero threshold: %d,",(ulong)bVar27);
          bVar27 = IsMouseDragging(uVar39,20.0);
          Text("  w/ large threshold: %d,",(ulong)bVar27);
          uVar39 = uVar39 + 1;
        } while (uVar39 != 3);
        local_d8._0_4_ = 0.0;
        local_d8._4_4_ = 0.0;
        Button("Drag Me",(ImVec2 *)local_d8);
        bVar27 = IsItemActive();
        if (bVar27) {
          pIVar36 = GetForegroundDrawList();
          IVar30 = GetColorU32(0x15,1.0);
          ImDrawList::AddLine(pIVar36,(ImVec2 *)((long)IVar55 + 0x3658),
                              (ImVec2 *)((long)IVar55 + 0xd8c),IVar30,4.0);
        }
        IVar56 = GetMouseDragDelta(0,0.0);
        uStack_110 = extraout_XMM0_Qb_02;
        local_118._0_4_ = IVar56.x;
        local_118._4_4_ = IVar56.y;
        local_48 = GetMouseDragDelta(0,-1.0);
        fVar50 = ((ImVec2 *)((long)IVar55 + 0xe8))->x;
        local_138 = (undefined1  [8])(double)*(float *)((long)IVar55 + 0xec);
        uStack_40 = extraout_XMM0_Qb_03;
        Text("GetMouseDragDelta(0):");
        Text("  w/ default threshold: (%.1f, %.1f)",(double)local_48.x,(double)local_48.y);
        Text("  w/ zero threshold: (%.1f, %.1f)",(double)(float)local_118._0_4_,
             (double)(float)local_118._4_4_);
        Text("io.MouseDelta: (%.1f, %.1f)",(double)fVar50,local_138);
        TreePop();
      }
      if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
        (*GImGuiDemoMarkerCallback)
                  ("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]imgui-ws/third-party/imgui/imgui/imgui_demo.cpp"
                   ,0x16ed,"Inputs, Navigation & Focus/Mouse cursors",
                   GImGuiDemoMarkerCallbackUserData);
      }
      bVar27 = TreeNode("Mouse cursors");
      if (bVar27) {
        IVar32 = GetMouseCursor();
        puVar47 = &DAT_001a89c0;
        Text("Current mouse cursor = %d: %s",(long)IVar32,(&DAT_001a89c0)[IVar32]);
        Text("Hover to see mouse cursors:");
        SameLine(0.0,-1.0);
        HelpMarker(
                  "Your application can render a different mouse cursor based on what ImGui::GetMouseCursor() returns. If software cursor rendering (io.MouseDrawCursor) is set ImGui will draw the right cursor for you, otherwise your backend needs to handle it."
                  );
        uVar72 = 0;
        do {
          sprintf(local_d8,"Mouse cursor %d: %s",uVar72 & 0xffffffff,*puVar47);
          Bullet();
          local_158.x = 0.0;
          local_158.y = 0.0;
          Selectable(local_d8,false,0,&local_158);
          bVar27 = IsItemHovered(0);
          if (bVar27) {
            SetMouseCursor((ImGuiMouseCursor)uVar72);
          }
          uVar72 = uVar72 + 1;
          puVar47 = puVar47 + 1;
        } while (uVar72 != 9);
        TreePop();
      }
    }
    PopItemWidth();
  }
  End();
  return;
}

Assistant:

void ImGui::ShowDemoWindow(bool* p_open)
{
    // Exceptionally add an extra assert here for people confused about initial Dear ImGui setup
    // Most ImGui functions would normally just crash if the context is missing.
    IM_ASSERT(ImGui::GetCurrentContext() != NULL && "Missing dear imgui context. Refer to examples app!");

    // Examples Apps (accessible from the "Examples" menu)
    static bool show_app_main_menu_bar = false;
    static bool show_app_documents = false;

    static bool show_app_console = false;
    static bool show_app_log = false;
    static bool show_app_layout = false;
    static bool show_app_property_editor = false;
    static bool show_app_long_text = false;
    static bool show_app_auto_resize = false;
    static bool show_app_constrained_resize = false;
    static bool show_app_simple_overlay = false;
    static bool show_app_fullscreen = false;
    static bool show_app_window_titles = false;
    static bool show_app_custom_rendering = false;

    if (show_app_main_menu_bar)       ShowExampleAppMainMenuBar();
    if (show_app_documents)           ShowExampleAppDocuments(&show_app_documents);

    if (show_app_console)             ShowExampleAppConsole(&show_app_console);
    if (show_app_log)                 ShowExampleAppLog(&show_app_log);
    if (show_app_layout)              ShowExampleAppLayout(&show_app_layout);
    if (show_app_property_editor)     ShowExampleAppPropertyEditor(&show_app_property_editor);
    if (show_app_long_text)           ShowExampleAppLongText(&show_app_long_text);
    if (show_app_auto_resize)         ShowExampleAppAutoResize(&show_app_auto_resize);
    if (show_app_constrained_resize)  ShowExampleAppConstrainedResize(&show_app_constrained_resize);
    if (show_app_simple_overlay)      ShowExampleAppSimpleOverlay(&show_app_simple_overlay);
    if (show_app_fullscreen)          ShowExampleAppFullscreen(&show_app_fullscreen);
    if (show_app_window_titles)       ShowExampleAppWindowTitles(&show_app_window_titles);
    if (show_app_custom_rendering)    ShowExampleAppCustomRendering(&show_app_custom_rendering);

    // Dear ImGui Apps (accessible from the "Tools" menu)
    static bool show_app_metrics = false;
    static bool show_app_stack_tool = false;
    static bool show_app_style_editor = false;
    static bool show_app_about = false;

    if (show_app_metrics)       { ImGui::ShowMetricsWindow(&show_app_metrics); }
    if (show_app_stack_tool)    { ImGui::ShowStackToolWindow(&show_app_stack_tool); }
    if (show_app_about)         { ImGui::ShowAboutWindow(&show_app_about); }
    if (show_app_style_editor)
    {
        ImGui::Begin("Dear ImGui Style Editor", &show_app_style_editor);
        ImGui::ShowStyleEditor();
        ImGui::End();
    }

    // Demonstrate the various window flags. Typically you would just use the default!
    static bool no_titlebar = false;
    static bool no_scrollbar = false;
    static bool no_menu = false;
    static bool no_move = false;
    static bool no_resize = false;
    static bool no_collapse = false;
    static bool no_close = false;
    static bool no_nav = false;
    static bool no_background = false;
    static bool no_bring_to_front = false;
    static bool unsaved_document = false;

    ImGuiWindowFlags window_flags = 0;
    if (no_titlebar)        window_flags |= ImGuiWindowFlags_NoTitleBar;
    if (no_scrollbar)       window_flags |= ImGuiWindowFlags_NoScrollbar;
    if (!no_menu)           window_flags |= ImGuiWindowFlags_MenuBar;
    if (no_move)            window_flags |= ImGuiWindowFlags_NoMove;
    if (no_resize)          window_flags |= ImGuiWindowFlags_NoResize;
    if (no_collapse)        window_flags |= ImGuiWindowFlags_NoCollapse;
    if (no_nav)             window_flags |= ImGuiWindowFlags_NoNav;
    if (no_background)      window_flags |= ImGuiWindowFlags_NoBackground;
    if (no_bring_to_front)  window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus;
    if (unsaved_document)   window_flags |= ImGuiWindowFlags_UnsavedDocument;
    if (no_close)           p_open = NULL; // Don't pass our bool* to Begin

    // We specify a default position/size in case there's no data in the .ini file.
    // We only do it to make the demo applications a little more welcoming, but typically this isn't required.
    const ImGuiViewport* main_viewport = ImGui::GetMainViewport();
    ImGui::SetNextWindowPos(ImVec2(main_viewport->WorkPos.x + 650, main_viewport->WorkPos.y + 20), ImGuiCond_FirstUseEver);
    ImGui::SetNextWindowSize(ImVec2(550, 680), ImGuiCond_FirstUseEver);

    // Main body of the Demo window starts here.
    if (!ImGui::Begin("Dear ImGui Demo", p_open, window_flags))
    {
        // Early out if the window is collapsed, as an optimization.
        ImGui::End();
        return;
    }

    // Most "big" widgets share a common width settings by default. See 'Demo->Layout->Widgets Width' for details.

    // e.g. Use 2/3 of the space for widgets and 1/3 for labels (right align)
    //ImGui::PushItemWidth(-ImGui::GetWindowWidth() * 0.35f);

    // e.g. Leave a fixed amount of width for labels (by passing a negative value), the rest goes to widgets.
    ImGui::PushItemWidth(ImGui::GetFontSize() * -12);

    // Menu Bar
    if (ImGui::BeginMenuBar())
    {
        if (ImGui::BeginMenu("Menu"))
        {
            IMGUI_DEMO_MARKER("Menu/File");
            ShowExampleMenuFile();
            ImGui::EndMenu();
        }
        if (ImGui::BeginMenu("Examples"))
        {
            IMGUI_DEMO_MARKER("Menu/Examples");
            ImGui::MenuItem("Main menu bar", NULL, &show_app_main_menu_bar);
            ImGui::MenuItem("Console", NULL, &show_app_console);
            ImGui::MenuItem("Log", NULL, &show_app_log);
            ImGui::MenuItem("Simple layout", NULL, &show_app_layout);
            ImGui::MenuItem("Property editor", NULL, &show_app_property_editor);
            ImGui::MenuItem("Long text display", NULL, &show_app_long_text);
            ImGui::MenuItem("Auto-resizing window", NULL, &show_app_auto_resize);
            ImGui::MenuItem("Constrained-resizing window", NULL, &show_app_constrained_resize);
            ImGui::MenuItem("Simple overlay", NULL, &show_app_simple_overlay);
            ImGui::MenuItem("Fullscreen window", NULL, &show_app_fullscreen);
            ImGui::MenuItem("Manipulating window titles", NULL, &show_app_window_titles);
            ImGui::MenuItem("Custom rendering", NULL, &show_app_custom_rendering);
            ImGui::MenuItem("Documents", NULL, &show_app_documents);
            ImGui::EndMenu();
        }
        //if (ImGui::MenuItem("MenuItem")) {} // You can also use MenuItem() inside a menu bar!
        if (ImGui::BeginMenu("Tools"))
        {
            IMGUI_DEMO_MARKER("Menu/Tools");
#ifndef IMGUI_DISABLE_METRICS_WINDOW
            ImGui::MenuItem("Metrics/Debugger", NULL, &show_app_metrics);
            ImGui::MenuItem("Stack Tool", NULL, &show_app_stack_tool);
#endif
            ImGui::MenuItem("Style Editor", NULL, &show_app_style_editor);
            ImGui::MenuItem("About Dear ImGui", NULL, &show_app_about);
            ImGui::EndMenu();
        }
        ImGui::EndMenuBar();
    }

    ImGui::Text("dear imgui says hello. (%s)", IMGUI_VERSION);
    ImGui::Spacing();

    IMGUI_DEMO_MARKER("Help");
    if (ImGui::CollapsingHeader("Help"))
    {
        ImGui::Text("ABOUT THIS DEMO:");
        ImGui::BulletText("Sections below are demonstrating many aspects of the library.");
        ImGui::BulletText("The \"Examples\" menu above leads to more demo contents.");
        ImGui::BulletText("The \"Tools\" menu above gives access to: About Box, Style Editor,\n"
                          "and Metrics/Debugger (general purpose Dear ImGui debugging tool).");
        ImGui::Separator();

        ImGui::Text("PROGRAMMER GUIDE:");
        ImGui::BulletText("See the ShowDemoWindow() code in imgui_demo.cpp. <- you are here!");
        ImGui::BulletText("See comments in imgui.cpp.");
        ImGui::BulletText("See example applications in the examples/ folder.");
        ImGui::BulletText("Read the FAQ at http://www.dearimgui.org/faq/");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableKeyboard' for keyboard controls.");
        ImGui::BulletText("Set 'io.ConfigFlags |= NavEnableGamepad' for gamepad controls.");
        ImGui::Separator();

        ImGui::Text("USER GUIDE:");
        ImGui::ShowUserGuide();
    }

    IMGUI_DEMO_MARKER("Configuration");
    if (ImGui::CollapsingHeader("Configuration"))
    {
        ImGuiIO& io = ImGui::GetIO();

        if (ImGui::TreeNode("Configuration##2"))
        {
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableKeyboard",    &io.ConfigFlags, ImGuiConfigFlags_NavEnableKeyboard);
            ImGui::SameLine(); HelpMarker("Enable keyboard controls.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableGamepad",     &io.ConfigFlags, ImGuiConfigFlags_NavEnableGamepad);
            ImGui::SameLine(); HelpMarker("Enable gamepad controls. Require backend to set io.BackendFlags |= ImGuiBackendFlags_HasGamepad.\n\nRead instructions in imgui.cpp for details.");
            ImGui::CheckboxFlags("io.ConfigFlags: NavEnableSetMousePos", &io.ConfigFlags, ImGuiConfigFlags_NavEnableSetMousePos);
            ImGui::SameLine(); HelpMarker("Instruct navigation to move the mouse cursor. See comment for ImGuiConfigFlags_NavEnableSetMousePos.");
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouse",              &io.ConfigFlags, ImGuiConfigFlags_NoMouse);
            if (io.ConfigFlags & ImGuiConfigFlags_NoMouse)
            {
                // The "NoMouse" option can get us stuck with a disabled mouse! Let's provide an alternative way to fix it:
                if (fmodf((float)ImGui::GetTime(), 0.40f) < 0.20f)
                {
                    ImGui::SameLine();
                    ImGui::Text("<<PRESS SPACE TO DISABLE>>");
                }
                if (ImGui::IsKeyPressed(ImGuiKey_Space))
                    io.ConfigFlags &= ~ImGuiConfigFlags_NoMouse;
            }
            ImGui::CheckboxFlags("io.ConfigFlags: NoMouseCursorChange", &io.ConfigFlags, ImGuiConfigFlags_NoMouseCursorChange);
            ImGui::SameLine(); HelpMarker("Instruct backend to not alter mouse cursor shape and visibility.");
            ImGui::Checkbox("io.ConfigInputTrickleEventQueue", &io.ConfigInputTrickleEventQueue);
            ImGui::SameLine(); HelpMarker("Enable input queue trickling: some types of events submitted during the same frame (e.g. button down + up) will be spread over multiple frames, improving interactions with low framerates.");
            ImGui::Checkbox("io.ConfigInputTextCursorBlink", &io.ConfigInputTextCursorBlink);
            ImGui::SameLine(); HelpMarker("Enable blinking cursor (optional as some users consider it to be distracting).");
            ImGui::Checkbox("io.ConfigDragClickToInputText", &io.ConfigDragClickToInputText);
            ImGui::SameLine(); HelpMarker("Enable turning DragXXX widgets into text input with a simple mouse click-release (without moving).");
            ImGui::Checkbox("io.ConfigWindowsResizeFromEdges", &io.ConfigWindowsResizeFromEdges);
            ImGui::SameLine(); HelpMarker("Enable resizing of windows from their edges and from the lower-left corner.\nThis requires (io.BackendFlags & ImGuiBackendFlags_HasMouseCursors) because it needs mouse cursor feedback.");
            ImGui::Checkbox("io.ConfigWindowsMoveFromTitleBarOnly", &io.ConfigWindowsMoveFromTitleBarOnly);
            ImGui::Checkbox("io.MouseDrawCursor", &io.MouseDrawCursor);
            ImGui::SameLine(); HelpMarker("Instruct Dear ImGui to render a mouse cursor itself. Note that a mouse cursor rendered via your application GPU rendering path will feel more laggy than hardware cursor, but will be more in sync with your other visuals.\n\nSome desktop applications may use both kinds of cursors (e.g. enable software cursor only when resizing/dragging something).");
            ImGui::Text("Also see Style->Rendering for rendering options.");
            ImGui::TreePop();
            ImGui::Separator();
        }

        IMGUI_DEMO_MARKER("Configuration/Backend Flags");
        if (ImGui::TreeNode("Backend Flags"))
        {
            HelpMarker(
                "Those flags are set by the backends (imgui_impl_xxx files) to specify their capabilities.\n"
                "Here we expose them as read-only fields to avoid breaking interactions with your backend.");

            // Make a local copy to avoid modifying actual backend flags.
            // FIXME: We don't use BeginDisabled() to keep label bright, maybe we need a BeginReadonly() equivalent..
            ImGuiBackendFlags backend_flags = io.BackendFlags;
            ImGui::CheckboxFlags("io.BackendFlags: HasGamepad",           &backend_flags, ImGuiBackendFlags_HasGamepad);
            ImGui::CheckboxFlags("io.BackendFlags: HasMouseCursors",      &backend_flags, ImGuiBackendFlags_HasMouseCursors);
            ImGui::CheckboxFlags("io.BackendFlags: HasSetMousePos",       &backend_flags, ImGuiBackendFlags_HasSetMousePos);
            ImGui::CheckboxFlags("io.BackendFlags: RendererHasVtxOffset", &backend_flags, ImGuiBackendFlags_RendererHasVtxOffset);
            ImGui::TreePop();
            ImGui::Separator();
        }

        IMGUI_DEMO_MARKER("Configuration/Style");
        if (ImGui::TreeNode("Style"))
        {
            HelpMarker("The same contents can be accessed in 'Tools->Style Editor' or by calling the ShowStyleEditor() function.");
            ImGui::ShowStyleEditor();
            ImGui::TreePop();
            ImGui::Separator();
        }

        IMGUI_DEMO_MARKER("Configuration/Capture, Logging");
        if (ImGui::TreeNode("Capture/Logging"))
        {
            HelpMarker(
                "The logging API redirects all text output so you can easily capture the content of "
                "a window or a block. Tree nodes can be automatically expanded.\n"
                "Try opening any of the contents below in this window and then click one of the \"Log To\" button.");
            ImGui::LogButtons();

            HelpMarker("You can also call ImGui::LogText() to output directly to the log without a visual output.");
            if (ImGui::Button("Copy \"Hello, world!\" to clipboard"))
            {
                ImGui::LogToClipboard();
                ImGui::LogText("Hello, world!");
                ImGui::LogFinish();
            }
            ImGui::TreePop();
        }
    }

    IMGUI_DEMO_MARKER("Window options");
    if (ImGui::CollapsingHeader("Window options"))
    {
        if (ImGui::BeginTable("split", 3))
        {
            ImGui::TableNextColumn(); ImGui::Checkbox("No titlebar", &no_titlebar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No scrollbar", &no_scrollbar);
            ImGui::TableNextColumn(); ImGui::Checkbox("No menu", &no_menu);
            ImGui::TableNextColumn(); ImGui::Checkbox("No move", &no_move);
            ImGui::TableNextColumn(); ImGui::Checkbox("No resize", &no_resize);
            ImGui::TableNextColumn(); ImGui::Checkbox("No collapse", &no_collapse);
            ImGui::TableNextColumn(); ImGui::Checkbox("No close", &no_close);
            ImGui::TableNextColumn(); ImGui::Checkbox("No nav", &no_nav);
            ImGui::TableNextColumn(); ImGui::Checkbox("No background", &no_background);
            ImGui::TableNextColumn(); ImGui::Checkbox("No bring to front", &no_bring_to_front);
            ImGui::TableNextColumn(); ImGui::Checkbox("Unsaved document", &unsaved_document);
            ImGui::EndTable();
        }
    }

    // All demo contents
    ShowDemoWindowWidgets();
    ShowDemoWindowLayout();
    ShowDemoWindowPopups();
    ShowDemoWindowTables();
    ShowDemoWindowMisc();

    // End of ShowDemoWindow()
    ImGui::PopItemWidth();
    ImGui::End();
}